

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Primitive PVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  byte bVar63;
  long lVar64;
  ulong uVar65;
  Geometry *pGVar66;
  uint uVar67;
  Geometry *geometry;
  long lVar68;
  bool bVar69;
  ulong uVar70;
  float fVar71;
  float fVar119;
  float fVar121;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar72;
  undefined1 auVar80 [16];
  float fVar120;
  float fVar122;
  float fVar124;
  float fVar125;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar123;
  float fVar126;
  float fVar127;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined4 uVar128;
  vint4 bi_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined8 uVar134;
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar153;
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar154;
  float fVar161;
  float fVar162;
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar163;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [64];
  vint4 ai_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_629;
  int local_624;
  Ray *local_620;
  RayQueryContext *local_618;
  undefined1 local_610 [16];
  Precalculations *local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCFilterFunctionNArguments local_5a0;
  undefined8 local_570;
  undefined4 local_568;
  float local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  uint local_554;
  uint local_550;
  ulong local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  Geometry *local_520;
  undefined8 uStack_518;
  undefined1 local_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  undefined4 uStack_49c;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  undefined1 auStack_3bc [8];
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  int local_33c;
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  byte local_2f0;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  uint local_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar62 = (ulong)(byte)PVar9;
  fVar143 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar76 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar137._0_4_ = fVar143 * (ray->dir).field_0.m128[0];
  auVar137._4_4_ = fVar143 * (ray->dir).field_0.m128[1];
  auVar137._8_4_ = fVar143 * (ray->dir).field_0.m128[2];
  auVar137._12_4_ = fVar143 * (ray->dir).field_0.m128[3];
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar169._0_4_ = fVar143 * auVar76._0_4_;
  auVar169._4_4_ = fVar143 * auVar76._4_4_;
  auVar169._8_4_ = fVar143 * auVar76._8_4_;
  auVar169._12_4_ = fVar143 * auVar76._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar62 + 6)));
  uVar70 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar62 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar65 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar184._4_4_ = auVar137._0_4_;
  auVar184._0_4_ = auVar137._0_4_;
  auVar184._8_4_ = auVar137._0_4_;
  auVar184._12_4_ = auVar137._0_4_;
  auVar79 = vshufps_avx(auVar137,auVar137,0x55);
  auVar73 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar143 = auVar73._0_4_;
  auVar155._0_4_ = fVar143 * auVar130._0_4_;
  fVar154 = auVar73._4_4_;
  auVar155._4_4_ = fVar154 * auVar130._4_4_;
  fVar161 = auVar73._8_4_;
  auVar155._8_4_ = fVar161 * auVar130._8_4_;
  fVar162 = auVar73._12_4_;
  auVar155._12_4_ = fVar162 * auVar130._12_4_;
  auVar135._0_4_ = auVar78._0_4_ * fVar143;
  auVar135._4_4_ = auVar78._4_4_ * fVar154;
  auVar135._8_4_ = auVar78._8_4_ * fVar161;
  auVar135._12_4_ = auVar78._12_4_ * fVar162;
  auVar80._0_4_ = auVar22._0_4_ * fVar143;
  auVar80._4_4_ = auVar22._4_4_ * fVar154;
  auVar80._8_4_ = auVar22._8_4_ * fVar161;
  auVar80._12_4_ = auVar22._12_4_ * fVar162;
  auVar73 = vfmadd231ps_fma(auVar155,auVar79,auVar76);
  auVar75 = vfmadd231ps_fma(auVar135,auVar79,auVar192);
  auVar79 = vfmadd231ps_fma(auVar80,auVar21,auVar79);
  auVar74 = vfmadd231ps_fma(auVar73,auVar184,auVar77);
  auVar75 = vfmadd231ps_fma(auVar75,auVar184,auVar19);
  auVar80 = vfmadd231ps_fma(auVar79,auVar20,auVar184);
  auVar185._4_4_ = auVar169._0_4_;
  auVar185._0_4_ = auVar169._0_4_;
  auVar185._8_4_ = auVar169._0_4_;
  auVar185._12_4_ = auVar169._0_4_;
  auVar79 = vshufps_avx(auVar169,auVar169,0x55);
  auVar73 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar143 = auVar73._0_4_;
  auVar170._0_4_ = fVar143 * auVar130._0_4_;
  fVar154 = auVar73._4_4_;
  auVar170._4_4_ = fVar154 * auVar130._4_4_;
  fVar161 = auVar73._8_4_;
  auVar170._8_4_ = fVar161 * auVar130._8_4_;
  fVar162 = auVar73._12_4_;
  auVar170._12_4_ = fVar162 * auVar130._12_4_;
  auVar144._0_4_ = auVar78._0_4_ * fVar143;
  auVar144._4_4_ = auVar78._4_4_ * fVar154;
  auVar144._8_4_ = auVar78._8_4_ * fVar161;
  auVar144._12_4_ = auVar78._12_4_ * fVar162;
  auVar138._0_4_ = auVar22._0_4_ * fVar143;
  auVar138._4_4_ = auVar22._4_4_ * fVar154;
  auVar138._8_4_ = auVar22._8_4_ * fVar161;
  auVar138._12_4_ = auVar22._12_4_ * fVar162;
  auVar76 = vfmadd231ps_fma(auVar170,auVar79,auVar76);
  auVar130 = vfmadd231ps_fma(auVar144,auVar79,auVar192);
  auVar192 = vfmadd231ps_fma(auVar138,auVar79,auVar21);
  auVar78 = vfmadd231ps_fma(auVar76,auVar185,auVar77);
  auVar21 = vfmadd231ps_fma(auVar130,auVar185,auVar19);
  auVar22 = vfmadd231ps_fma(auVar192,auVar185,auVar20);
  auVar177._8_4_ = 0x7fffffff;
  auVar177._0_8_ = 0x7fffffff7fffffff;
  auVar177._12_4_ = 0x7fffffff;
  auVar77 = vandps_avx(auVar177,auVar74);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar77,auVar172,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar73._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._12_4_;
  auVar77 = vandps_avx(auVar177,auVar75);
  uVar70 = vcmpps_avx512vl(auVar77,auVar172,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar74._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._12_4_;
  auVar77 = vandps_avx(auVar177,auVar80);
  uVar70 = vcmpps_avx512vl(auVar77,auVar172,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar75._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._12_4_;
  auVar76 = vrcp14ps_avx512vl(auVar73);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = &DAT_3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar73,auVar76,auVar173);
  auVar19 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar74);
  auVar77 = vfnmadd213ps_fma(auVar74,auVar76,auVar173);
  auVar192 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar75);
  auVar77 = vfnmadd213ps_fma(auVar75,auVar76,auVar173);
  auVar20 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar130 = vsubps_avx(auVar77,auVar78);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar76);
  auVar164._0_4_ = auVar19._0_4_ * auVar130._0_4_;
  auVar164._4_4_ = auVar19._4_4_ * auVar130._4_4_;
  auVar164._8_4_ = auVar19._8_4_ * auVar130._8_4_;
  auVar164._12_4_ = auVar19._12_4_ * auVar130._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar156._0_4_ = auVar19._0_4_ * auVar77._0_4_;
  auVar156._4_4_ = auVar19._4_4_ * auVar77._4_4_;
  auVar156._8_4_ = auVar19._8_4_ * auVar77._8_4_;
  auVar156._12_4_ = auVar19._12_4_ * auVar77._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar76 = vpmovsxwd_avx(auVar130);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar62 * -2 + 6);
  auVar77 = vpmovsxwd_avx(auVar19);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar21);
  auVar174._0_4_ = auVar192._0_4_ * auVar77._0_4_;
  auVar174._4_4_ = auVar192._4_4_ * auVar77._4_4_;
  auVar174._8_4_ = auVar192._8_4_ * auVar77._8_4_;
  auVar174._12_4_ = auVar192._12_4_ * auVar77._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar76);
  auVar77 = vsubps_avx(auVar77,auVar21);
  auVar136._0_4_ = auVar192._0_4_ * auVar77._0_4_;
  auVar136._4_4_ = auVar192._4_4_ * auVar77._4_4_;
  auVar136._8_4_ = auVar192._8_4_ * auVar77._8_4_;
  auVar136._12_4_ = auVar192._12_4_ * auVar77._12_4_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar65 + uVar62 + 6);
  auVar77 = vpmovsxwd_avx(auVar192);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar22);
  auVar145._0_4_ = auVar20._0_4_ * auVar77._0_4_;
  auVar145._4_4_ = auVar20._4_4_ * auVar77._4_4_;
  auVar145._8_4_ = auVar20._8_4_ * auVar77._8_4_;
  auVar145._12_4_ = auVar20._12_4_ * auVar77._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar77 = vpmovsxwd_avx(auVar78);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar22);
  auVar129._0_4_ = auVar20._0_4_ * auVar77._0_4_;
  auVar129._4_4_ = auVar20._4_4_ * auVar77._4_4_;
  auVar129._8_4_ = auVar20._8_4_ * auVar77._8_4_;
  auVar129._12_4_ = auVar20._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar164,auVar156);
  auVar76 = vpminsd_avx(auVar174,auVar136);
  auVar77 = vmaxps_avx(auVar77,auVar76);
  auVar76 = vpminsd_avx(auVar145,auVar129);
  uVar128 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar20._4_4_ = uVar128;
  auVar20._0_4_ = uVar128;
  auVar20._8_4_ = uVar128;
  auVar20._12_4_ = uVar128;
  auVar76 = vmaxps_avx512vl(auVar76,auVar20);
  auVar77 = vmaxps_avx(auVar77,auVar76);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_1f0 = vmulps_avx512vl(auVar77,auVar21);
  auVar171 = ZEXT1664(local_1f0);
  auVar77 = vpmaxsd_avx(auVar164,auVar156);
  auVar142 = ZEXT1664(auVar77);
  auVar76 = vpmaxsd_avx(auVar174,auVar136);
  auVar77 = vminps_avx(auVar77,auVar76);
  auVar76 = vpmaxsd_avx(auVar145,auVar129);
  fVar143 = ray->tfar;
  auVar22._4_4_ = fVar143;
  auVar22._0_4_ = fVar143;
  auVar22._8_4_ = fVar143;
  auVar22._12_4_ = fVar143;
  auVar76 = vminps_avx512vl(auVar76,auVar22);
  auVar77 = vminps_avx(auVar77,auVar76);
  auVar79._8_4_ = 0x3f800003;
  auVar79._0_8_ = 0x3f8000033f800003;
  auVar79._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar79);
  auVar76 = vpbroadcastd_avx512vl();
  uVar134 = vcmpps_avx512vl(local_1f0,auVar77,2);
  uVar70 = vpcmpgtd_avx512vl(auVar76,_DAT_01ff0cf0);
  uVar70 = ((byte)uVar134 & 0xf) & uVar70;
  local_629 = (char)uVar70 != '\0';
  if (local_629) {
    do {
      auVar109 = auVar171._0_32_;
      auVar108 = auVar142._0_32_;
      local_460 = in_ZMM21._0_32_;
      local_440 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar62 = uVar70; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_5e8 = (ulong)*(uint *)(prim + 2);
      local_538 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      pGVar66 = (context->scene->geometries).items[local_5e8].ptr;
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar66->field_0x58 +
                               pGVar66[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_538);
      p_Var11 = pGVar66[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar66[1].time_range.upper;
      local_610 = *(undefined1 (*) [16])(lVar24 + (long)p_Var11 * uVar62);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar62 + 1) * (long)p_Var11);
      local_4f0 = *(undefined8 *)*pauVar3;
      uStack_4e8 = *(undefined8 *)(*pauVar3 + 8);
      auVar77 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar62 + 2) * (long)p_Var11);
      local_520 = *(Geometry **)*pauVar4;
      uStack_4f8 = *(undefined8 *)(*pauVar4 + 8);
      auVar76 = *pauVar4;
      uVar70 = uVar70 - 1 & uVar70;
      pauVar5 = (undefined1 (*) [16])(lVar24 + (uVar62 + 3) * (long)p_Var11);
      local_490 = *(undefined8 *)*pauVar5;
      uStack_488 = *(undefined8 *)(*pauVar5 + 8);
      auVar130 = *pauVar5;
      if (uVar70 != 0) {
        uVar65 = uVar70 - 1 & uVar70;
        for (uVar62 = uVar70; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        }
        if (uVar65 != 0) {
          for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar66[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->org).field_0;
      auVar192 = vsubps_avx(local_610,(undefined1  [16])aVar6);
      uVar128 = auVar192._0_4_;
      auVar139._4_4_ = uVar128;
      auVar139._0_4_ = uVar128;
      auVar139._8_4_ = uVar128;
      auVar139._12_4_ = uVar128;
      auVar19 = vshufps_avx(auVar192,auVar192,0x55);
      auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar143 = (pre->ray_space).vz.field_0.m128[0];
      fVar154 = (pre->ray_space).vz.field_0.m128[1];
      fVar161 = (pre->ray_space).vz.field_0.m128[2];
      fVar162 = (pre->ray_space).vz.field_0.m128[3];
      auVar178._0_4_ = auVar192._0_4_ * fVar143;
      auVar178._4_4_ = auVar192._4_4_ * fVar154;
      auVar178._8_4_ = auVar192._8_4_ * fVar161;
      auVar178._12_4_ = auVar192._12_4_ * fVar162;
      auVar19 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar8,auVar19);
      auVar20 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar139);
      auVar19 = vshufps_avx(local_610,local_610,0xff);
      auVar78 = vsubps_avx(auVar77,(undefined1  [16])aVar6);
      uVar128 = auVar78._0_4_;
      auVar146._4_4_ = uVar128;
      auVar146._0_4_ = uVar128;
      auVar146._8_4_ = uVar128;
      auVar146._12_4_ = uVar128;
      auVar192 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar179._0_4_ = auVar78._0_4_ * fVar143;
      auVar179._4_4_ = auVar78._4_4_ * fVar154;
      auVar179._8_4_ = auVar78._8_4_ * fVar161;
      auVar179._12_4_ = auVar78._12_4_ * fVar162;
      auVar192 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar8,auVar192);
      auVar21 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar146);
      auVar77 = vshufps_avx(auVar77,auVar77,0xff);
      auVar78 = vsubps_avx(auVar76,(undefined1  [16])aVar6);
      uVar128 = auVar78._0_4_;
      auVar175._4_4_ = uVar128;
      auVar175._0_4_ = uVar128;
      auVar175._8_4_ = uVar128;
      auVar175._12_4_ = uVar128;
      auVar192 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar182._0_4_ = auVar78._0_4_ * fVar143;
      auVar182._4_4_ = auVar78._4_4_ * fVar154;
      auVar182._8_4_ = auVar78._8_4_ * fVar161;
      auVar182._12_4_ = auVar78._12_4_ * fVar162;
      auVar192 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar8,auVar192);
      auVar22 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar175);
      auVar76 = vshufps_avx(auVar76,auVar76,0xff);
      auVar78 = vsubps_avx512vl(auVar130,(undefined1  [16])aVar6);
      uVar128 = auVar78._0_4_;
      auVar147._4_4_ = uVar128;
      auVar147._0_4_ = uVar128;
      auVar147._8_4_ = uVar128;
      auVar147._12_4_ = uVar128;
      auVar192 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar183._0_4_ = auVar78._0_4_ * fVar143;
      auVar183._4_4_ = auVar78._4_4_ * fVar154;
      auVar183._8_4_ = auVar78._8_4_ * fVar161;
      auVar183._12_4_ = auVar78._12_4_ * fVar162;
      auVar192 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar8,auVar192);
      auVar192 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar147);
      lVar24 = (long)iVar10 * 0x44;
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar78 = vshufps_avx512vl(auVar130,auVar130,0xff);
      local_400 = vbroadcastss_avx512vl(auVar20);
      auVar81._8_4_ = 1;
      auVar81._0_8_ = 0x100000001;
      auVar81._12_4_ = 1;
      auVar81._16_4_ = 1;
      auVar81._20_4_ = 1;
      auVar81._24_4_ = 1;
      auVar81._28_4_ = 1;
      local_4c0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar20));
      uVar134 = auVar19._0_8_;
      local_80._8_8_ = uVar134;
      local_80._0_8_ = uVar134;
      local_80._16_8_ = uVar134;
      local_80._24_8_ = uVar134;
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar128 = auVar21._0_4_;
      local_4e0._4_4_ = uVar128;
      local_4e0._0_4_ = uVar128;
      local_4e0._8_4_ = uVar128;
      local_4e0._12_4_ = uVar128;
      local_4e0._16_4_ = uVar128;
      local_4e0._20_4_ = uVar128;
      local_4e0._24_4_ = uVar128;
      local_4e0._28_4_ = uVar128;
      local_a0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar21));
      uVar134 = auVar77._0_8_;
      local_c0._8_8_ = uVar134;
      local_c0._0_8_ = uVar134;
      local_c0._16_8_ = uVar134;
      local_c0._24_8_ = uVar134;
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar22);
      local_100 = vpermps_avx512vl(auVar81,ZEXT1632(auVar22));
      local_120 = vbroadcastsd_avx512vl(auVar76);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_140 = vbroadcastss_avx512vl(auVar192);
      local_160 = vpermps_avx512vl(auVar81,ZEXT1632(auVar192));
      _local_180 = vbroadcastsd_avx512vl(auVar78);
      auVar81 = vmulps_avx512vl(local_140,auVar95);
      auVar82 = vmulps_avx512vl(local_160,auVar95);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar96,local_e0);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,local_100);
      auVar77 = vfmadd231ps_fma(auVar81,auVar99,local_4e0);
      auVar83 = vfmadd231ps_avx512vl(auVar82,auVar99,local_a0);
      auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar97,local_400);
      auVar81 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar85 = vfmadd231ps_avx512vl(auVar83,auVar97,local_4c0);
      auVar83 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar86 = vmulps_avx512vl(local_140,auVar94);
      auVar87 = vmulps_avx512vl(local_160,auVar94);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar83,local_e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,local_100);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_4e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_a0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_400);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar81,local_4c0);
      auVar88 = vsubps_avx512vl(auVar86,auVar84);
      auVar89 = vsubps_avx512vl(auVar87,auVar85);
      auVar90 = vmulps_avx512vl(auVar85,auVar88);
      auVar91 = vmulps_avx512vl(auVar84,auVar89);
      auVar90 = vsubps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(_local_180,auVar95);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_120);
      auVar77 = vfmadd231ps_fma(auVar91,auVar99,local_c0);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar97,local_80);
      auVar92 = vmulps_avx512vl(_local_180,auVar94);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,local_120);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar82,local_c0);
      auVar19 = vfmadd231ps_fma(auVar92,auVar81,local_80);
      auVar92 = vmulps_avx512vl(auVar89,auVar89);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar88);
      auVar93 = vmaxps_avx512vl(auVar91,ZEXT1632(auVar19));
      auVar93 = vmulps_avx512vl(auVar93,auVar93);
      auVar92 = vmulps_avx512vl(auVar93,auVar92);
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      uVar134 = vcmpps_avx512vl(auVar90,auVar92,2);
      auVar77 = vblendps_avx(auVar20,local_610,8);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar76 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vblendps_avx(auVar21,*pauVar3,8);
      auVar77 = vandps_avx512vl(auVar77,auVar78);
      auVar76 = vmaxps_avx(auVar76,auVar77);
      auVar77 = vblendps_avx(auVar22,*pauVar4,8);
      auVar79 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vblendps_avx(auVar192,auVar130,8);
      auVar77 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vmaxps_avx(auVar79,auVar77);
      auVar77 = vmaxps_avx(auVar76,auVar77);
      auVar76 = vmovshdup_avx(auVar77);
      auVar76 = vmaxss_avx(auVar76,auVar77);
      auVar77 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vmaxss_avx(auVar77,auVar76);
      auVar92._0_4_ = (float)iVar10;
      _auStack_3bc = auVar20._4_12_;
      auVar92._4_4_ = auVar92._0_4_;
      auVar92._8_4_ = auVar92._0_4_;
      auVar92._12_4_ = auVar92._0_4_;
      auVar92._16_4_ = auVar92._0_4_;
      auVar92._20_4_ = auVar92._0_4_;
      auVar92._24_4_ = auVar92._0_4_;
      auVar92._28_4_ = auVar92._0_4_;
      uVar23 = vcmpps_avx512vl(auVar92,_DAT_02020f40,0xe);
      local_2f0 = (byte)uVar134 & (byte)uVar23;
      local_3e0 = auVar77._0_4_ * 4.7683716e-07;
      auVar90._8_4_ = 2;
      auVar90._0_8_ = 0x200000002;
      auVar90._12_4_ = 2;
      auVar90._16_4_ = 2;
      auVar90._20_4_ = 2;
      auVar90._24_4_ = 2;
      auVar90._28_4_ = 2;
      local_1a0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar20));
      local_1c0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar21));
      local_1e0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar22));
      local_420 = vpermps_avx2(auVar90,ZEXT1632(auVar192));
      uVar67 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      auVar76 = local_140._0_16_;
      auVar77 = ZEXT416((uint)local_3e0);
      local_618 = context;
      local_620 = ray;
      local_5f8 = pre;
      local_500 = local_520;
      local_3c0 = auVar92._0_4_;
      if (local_2f0 == 0) {
        bVar69 = false;
        auVar77 = vxorps_avx512vl(auVar76,auVar76);
        auVar193 = ZEXT1664(auVar77);
        auVar171 = ZEXT3264(auVar109);
        in_ZMM20 = ZEXT3264(local_440);
        auVar142 = ZEXT3264(auVar108);
        in_ZMM21 = ZEXT3264(local_460);
        auVar191 = ZEXT3264(local_400);
        auVar190 = ZEXT3264(local_4c0);
        auVar189 = ZEXT3264(local_4e0);
      }
      else {
        local_480._0_16_ = ZEXT416(uVar67);
        auVar94 = vmulps_avx512vl(local_420,auVar94);
        auVar83 = vfmadd213ps_avx512vl(auVar83,local_1e0,auVar94);
        auVar82 = vfmadd213ps_avx512vl(auVar82,local_1c0,auVar83);
        auVar90 = vfmadd213ps_avx512vl(auVar81,local_1a0,auVar82);
        auVar95 = vmulps_avx512vl(local_420,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_1e0,auVar95);
        auVar82 = vfmadd213ps_avx512vl(auVar99,local_1c0,auVar96);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar81 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar93 = vfmadd213ps_avx512vl(auVar97,local_1a0,auVar82);
        auVar82 = vmulps_avx512vl(local_140,auVar81);
        auVar83 = vmulps_avx512vl(local_160,auVar81);
        auVar97._4_4_ = local_420._4_4_ * auVar81._4_4_;
        auVar97._0_4_ = local_420._0_4_ * auVar81._0_4_;
        auVar97._8_4_ = local_420._8_4_ * auVar81._8_4_;
        auVar97._12_4_ = local_420._12_4_ * auVar81._12_4_;
        auVar97._16_4_ = local_420._16_4_ * auVar81._16_4_;
        auVar97._20_4_ = local_420._20_4_ * auVar81._20_4_;
        auVar97._24_4_ = local_420._24_4_ * auVar81._24_4_;
        auVar97._28_4_ = auVar81._28_4_;
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar95,local_e0);
        auVar82 = vfmadd231ps_avx512vl(auVar83,auVar95,local_100);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_1e0,auVar95);
        auVar95 = vfmadd231ps_avx512vl(auVar81,auVar96,local_4e0);
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar96,local_a0);
        auVar82 = vfmadd231ps_avx512vl(auVar97,local_1c0,auVar96);
        auVar83 = vfmadd231ps_avx512vl(auVar95,auVar99,local_400);
        auVar190 = ZEXT3264(local_4c0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar99,local_4c0);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_1a0,auVar99);
        auVar94 = vmulps_avx512vl(local_140,auVar95);
        auVar98 = vmulps_avx512vl(local_160,auVar95);
        auVar99._4_4_ = local_420._4_4_ * auVar95._4_4_;
        auVar99._0_4_ = local_420._0_4_ * auVar95._0_4_;
        auVar99._8_4_ = local_420._8_4_ * auVar95._8_4_;
        auVar99._12_4_ = local_420._12_4_ * auVar95._12_4_;
        auVar99._16_4_ = local_420._16_4_ * auVar95._16_4_;
        auVar99._20_4_ = local_420._20_4_ * auVar95._20_4_;
        auVar99._24_4_ = local_420._24_4_ * auVar95._24_4_;
        auVar99._28_4_ = auVar95._28_4_;
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar96,local_e0);
        auVar94 = vfmadd231ps_avx512vl(auVar98,auVar96,local_100);
        auVar96 = vfmadd231ps_avx512vl(auVar99,local_1e0,auVar96);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,local_4e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_a0);
        auVar99 = vfmadd231ps_avx512vl(auVar96,local_1c0,auVar99);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar97,local_400);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar97,local_4c0);
        auVar94 = vfmadd231ps_avx512vl(auVar99,local_1a0,auVar97);
        auVar187._8_4_ = 0x7fffffff;
        auVar187._0_8_ = 0x7fffffff7fffffff;
        auVar187._12_4_ = 0x7fffffff;
        auVar187._16_4_ = 0x7fffffff;
        auVar187._20_4_ = 0x7fffffff;
        auVar187._24_4_ = 0x7fffffff;
        auVar187._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar83,auVar187);
        auVar99 = vandps_avx(auVar81,auVar187);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar82,auVar187);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        auVar82 = vbroadcastss_avx512vl(auVar77);
        uVar62 = vcmpps_avx512vl(auVar97,auVar82,1);
        bVar69 = (bool)((byte)uVar62 & 1);
        auVar98._0_4_ = (float)((uint)bVar69 * auVar88._0_4_ | (uint)!bVar69 * auVar83._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar69 * auVar88._4_4_ | (uint)!bVar69 * auVar83._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar69 * auVar88._8_4_ | (uint)!bVar69 * auVar83._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar69 * auVar88._12_4_ | (uint)!bVar69 * auVar83._12_4_);
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar69 * auVar88._16_4_ | (uint)!bVar69 * auVar83._16_4_);
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar69 * auVar88._20_4_ | (uint)!bVar69 * auVar83._20_4_);
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar69 * auVar88._24_4_ | (uint)!bVar69 * auVar83._24_4_);
        bVar69 = SUB81(uVar62 >> 7,0);
        auVar98._28_4_ = (uint)bVar69 * auVar88._28_4_ | (uint)!bVar69 * auVar83._28_4_;
        bVar69 = (bool)((byte)uVar62 & 1);
        auVar100._0_4_ = (float)((uint)bVar69 * auVar89._0_4_ | (uint)!bVar69 * auVar81._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar81._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar81._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar81._12_4_);
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * auVar81._16_4_);
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * auVar81._20_4_);
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * auVar81._24_4_);
        bVar69 = SUB81(uVar62 >> 7,0);
        auVar100._28_4_ = (uint)bVar69 * auVar89._28_4_ | (uint)!bVar69 * auVar81._28_4_;
        auVar97 = vandps_avx(auVar187,auVar96);
        auVar99 = vandps_avx(auVar95,auVar187);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar94,auVar187);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        uVar62 = vcmpps_avx512vl(auVar97,auVar82,1);
        bVar69 = (bool)((byte)uVar62 & 1);
        auVar101._0_4_ = (float)((uint)bVar69 * auVar88._0_4_ | (uint)!bVar69 * auVar96._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar69 * auVar88._4_4_ | (uint)!bVar69 * auVar96._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar69 * auVar88._8_4_ | (uint)!bVar69 * auVar96._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar69 * auVar88._12_4_ | (uint)!bVar69 * auVar96._12_4_);
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar69 * auVar88._16_4_ | (uint)!bVar69 * auVar96._16_4_);
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar69 * auVar88._20_4_ | (uint)!bVar69 * auVar96._20_4_);
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar69 * auVar88._24_4_ | (uint)!bVar69 * auVar96._24_4_);
        bVar69 = SUB81(uVar62 >> 7,0);
        auVar101._28_4_ = (uint)bVar69 * auVar88._28_4_ | (uint)!bVar69 * auVar96._28_4_;
        bVar69 = (bool)((byte)uVar62 & 1);
        auVar102._0_4_ = (float)((uint)bVar69 * auVar89._0_4_ | (uint)!bVar69 * auVar95._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar95._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar95._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar95._12_4_);
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * auVar95._16_4_);
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * auVar95._20_4_);
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * auVar95._24_4_);
        bVar69 = SUB81(uVar62 >> 7,0);
        auVar102._28_4_ = (uint)bVar69 * auVar89._28_4_ | (uint)!bVar69 * auVar95._28_4_;
        auVar80 = vxorps_avx512vl(auVar76,auVar76);
        auVar193 = ZEXT1664(auVar80);
        auVar97 = vfmadd213ps_avx512vl(auVar98,auVar98,ZEXT1632(auVar80));
        auVar76 = vfmadd231ps_fma(auVar97,auVar100,auVar100);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar143 = auVar97._0_4_;
        fVar154 = auVar97._4_4_;
        fVar161 = auVar97._8_4_;
        fVar162 = auVar97._12_4_;
        fVar163 = auVar97._16_4_;
        fVar153 = auVar97._20_4_;
        fVar71 = auVar97._24_4_;
        auVar96._4_4_ = fVar154 * fVar154 * fVar154 * auVar76._4_4_ * -0.5;
        auVar96._0_4_ = fVar143 * fVar143 * fVar143 * auVar76._0_4_ * -0.5;
        auVar96._8_4_ = fVar161 * fVar161 * fVar161 * auVar76._8_4_ * -0.5;
        auVar96._12_4_ = fVar162 * fVar162 * fVar162 * auVar76._12_4_ * -0.5;
        auVar96._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar96._20_4_ = fVar153 * fVar153 * fVar153 * -0.0;
        auVar96._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar96._28_4_ = 0;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar97);
        auVar95._4_4_ = auVar100._4_4_ * auVar96._4_4_;
        auVar95._0_4_ = auVar100._0_4_ * auVar96._0_4_;
        auVar95._8_4_ = auVar100._8_4_ * auVar96._8_4_;
        auVar95._12_4_ = auVar100._12_4_ * auVar96._12_4_;
        auVar95._16_4_ = auVar100._16_4_ * auVar96._16_4_;
        auVar95._20_4_ = auVar100._20_4_ * auVar96._20_4_;
        auVar95._24_4_ = auVar100._24_4_ * auVar96._24_4_;
        auVar95._28_4_ = auVar97._28_4_;
        auVar82._4_4_ = auVar96._4_4_ * -auVar98._4_4_;
        auVar82._0_4_ = auVar96._0_4_ * -auVar98._0_4_;
        auVar82._8_4_ = auVar96._8_4_ * -auVar98._8_4_;
        auVar82._12_4_ = auVar96._12_4_ * -auVar98._12_4_;
        auVar82._16_4_ = auVar96._16_4_ * -auVar98._16_4_;
        auVar82._20_4_ = auVar96._20_4_ * -auVar98._20_4_;
        auVar82._24_4_ = auVar96._24_4_ * -auVar98._24_4_;
        auVar82._28_4_ = auVar98._28_4_ ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar89 = ZEXT1632(auVar80);
        auVar81 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar89);
        auVar76 = vfmadd231ps_fma(auVar81,auVar102,auVar102);
        auVar81 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar143 = auVar81._0_4_;
        fVar154 = auVar81._4_4_;
        fVar161 = auVar81._8_4_;
        fVar162 = auVar81._12_4_;
        fVar163 = auVar81._16_4_;
        fVar153 = auVar81._20_4_;
        fVar71 = auVar81._24_4_;
        auVar83._4_4_ = fVar154 * fVar154 * fVar154 * auVar76._4_4_ * -0.5;
        auVar83._0_4_ = fVar143 * fVar143 * fVar143 * auVar76._0_4_ * -0.5;
        auVar83._8_4_ = fVar161 * fVar161 * fVar161 * auVar76._8_4_ * -0.5;
        auVar83._12_4_ = fVar162 * fVar162 * fVar162 * auVar76._12_4_ * -0.5;
        auVar83._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar83._20_4_ = fVar153 * fVar153 * fVar153 * -0.0;
        auVar83._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar83._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar81);
        auVar94._4_4_ = auVar102._4_4_ * auVar99._4_4_;
        auVar94._0_4_ = auVar102._0_4_ * auVar99._0_4_;
        auVar94._8_4_ = auVar102._8_4_ * auVar99._8_4_;
        auVar94._12_4_ = auVar102._12_4_ * auVar99._12_4_;
        auVar94._16_4_ = auVar102._16_4_ * auVar99._16_4_;
        auVar94._20_4_ = auVar102._20_4_ * auVar99._20_4_;
        auVar94._24_4_ = auVar102._24_4_ * auVar99._24_4_;
        auVar94._28_4_ = auVar81._28_4_;
        auVar88._4_4_ = -auVar101._4_4_ * auVar99._4_4_;
        auVar88._0_4_ = -auVar101._0_4_ * auVar99._0_4_;
        auVar88._8_4_ = -auVar101._8_4_ * auVar99._8_4_;
        auVar88._12_4_ = -auVar101._12_4_ * auVar99._12_4_;
        auVar88._16_4_ = -auVar101._16_4_ * auVar99._16_4_;
        auVar88._20_4_ = -auVar101._20_4_ * auVar99._20_4_;
        auVar88._24_4_ = -auVar101._24_4_ * auVar99._24_4_;
        auVar88._28_4_ = auVar96._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,auVar89);
        auVar76 = vfmadd213ps_fma(auVar95,auVar91,auVar84);
        auVar130 = vfmadd213ps_fma(auVar82,auVar91,auVar85);
        auVar96 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar93);
        auVar81 = vfmadd213ps_avx512vl(auVar94,ZEXT1632(auVar19),auVar86);
        auVar22 = vfnmadd213ps_fma(auVar95,auVar91,auVar84);
        auVar83 = ZEXT1632(auVar19);
        auVar192 = vfmadd213ps_fma(auVar88,auVar83,auVar87);
        auVar79 = vfnmadd213ps_fma(auVar82,auVar91,auVar85);
        auVar78 = vfmadd213ps_fma(auVar99,auVar83,auVar90);
        auVar95 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar97);
        auVar73 = vfnmadd213ps_fma(auVar94,auVar83,auVar86);
        auVar75 = vfnmadd213ps_fma(auVar88,auVar83,auVar87);
        auVar74 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar19),auVar99);
        auVar99 = vsubps_avx512vl(auVar81,ZEXT1632(auVar22));
        auVar97 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar79));
        auVar82 = vsubps_avx512vl(ZEXT1632(auVar78),auVar95);
        auVar83 = vmulps_avx512vl(auVar97,auVar95);
        auVar20 = vfmsub231ps_fma(auVar83,ZEXT1632(auVar79),auVar82);
        auVar84._4_4_ = auVar22._4_4_ * auVar82._4_4_;
        auVar84._0_4_ = auVar22._0_4_ * auVar82._0_4_;
        auVar84._8_4_ = auVar22._8_4_ * auVar82._8_4_;
        auVar84._12_4_ = auVar22._12_4_ * auVar82._12_4_;
        auVar84._16_4_ = auVar82._16_4_ * 0.0;
        auVar84._20_4_ = auVar82._20_4_ * 0.0;
        auVar84._24_4_ = auVar82._24_4_ * 0.0;
        auVar84._28_4_ = auVar82._28_4_;
        auVar82 = vfmsub231ps_avx512vl(auVar84,auVar95,auVar99);
        auVar85._4_4_ = auVar79._4_4_ * auVar99._4_4_;
        auVar85._0_4_ = auVar79._0_4_ * auVar99._0_4_;
        auVar85._8_4_ = auVar79._8_4_ * auVar99._8_4_;
        auVar85._12_4_ = auVar79._12_4_ * auVar99._12_4_;
        auVar85._16_4_ = auVar99._16_4_ * 0.0;
        auVar85._20_4_ = auVar99._20_4_ * 0.0;
        auVar85._24_4_ = auVar99._24_4_ * 0.0;
        auVar85._28_4_ = auVar99._28_4_;
        auVar21 = vfmsub231ps_fma(auVar85,ZEXT1632(auVar22),auVar97);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar89,auVar82);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,ZEXT1632(auVar20));
        auVar88 = ZEXT1632(auVar80);
        uVar62 = vcmpps_avx512vl(auVar97,auVar88,2);
        bVar63 = (byte)uVar62;
        fVar71 = (float)((uint)(bVar63 & 1) * auVar76._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar73._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar119 = (float)((uint)bVar69 * auVar76._4_4_ | (uint)!bVar69 * auVar73._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar121 = (float)((uint)bVar69 * auVar76._8_4_ | (uint)!bVar69 * auVar73._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar124 = (float)((uint)bVar69 * auVar76._12_4_ | (uint)!bVar69 * auVar73._12_4_);
        auVar83 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar121,CONCAT44(fVar119,fVar71))));
        fVar72 = (float)((uint)(bVar63 & 1) * auVar130._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar75._0_4_);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar120 = (float)((uint)bVar69 * auVar130._4_4_ | (uint)!bVar69 * auVar75._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar122 = (float)((uint)bVar69 * auVar130._8_4_ | (uint)!bVar69 * auVar75._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar125 = (float)((uint)bVar69 * auVar130._12_4_ | (uint)!bVar69 * auVar75._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar122,CONCAT44(fVar120,fVar72))));
        auVar93._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar74._0_4_)
        ;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar93._4_4_ = (float)((uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * auVar74._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar93._8_4_ = (float)((uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * auVar74._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar93._12_4_ = (float)((uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * auVar74._12_4_);
        fVar143 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_);
        auVar93._16_4_ = fVar143;
        fVar154 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_);
        auVar93._20_4_ = fVar154;
        fVar161 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_);
        auVar93._24_4_ = fVar161;
        iVar1 = (uint)(byte)(uVar62 >> 7) * auVar96._28_4_;
        auVar93._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar81);
        auVar103._0_4_ =
             (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar20._0_4_;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar69 * auVar99._4_4_ | (uint)!bVar69 * auVar20._4_4_;
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar69 * auVar99._8_4_ | (uint)!bVar69 * auVar20._8_4_;
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar69 * auVar99._12_4_ | (uint)!bVar69 * auVar20._12_4_;
        auVar103._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar99._16_4_;
        auVar103._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar99._20_4_;
        auVar103._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar99._24_4_;
        auVar103._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar192));
        auVar104._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar130._0_4_
                    );
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar69 * auVar99._4_4_ | (uint)!bVar69 * auVar130._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar69 * auVar99._8_4_ | (uint)!bVar69 * auVar130._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar69 * auVar99._12_4_ | (uint)!bVar69 * auVar130._12_4_);
        fVar162 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar99._16_4_);
        auVar104._16_4_ = fVar162;
        fVar163 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar99._20_4_);
        auVar104._20_4_ = fVar163;
        fVar153 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar99._24_4_);
        auVar104._24_4_ = fVar153;
        auVar104._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar78));
        auVar105._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar96._0_4_)
        ;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar69 * auVar99._4_4_ | (uint)!bVar69 * auVar96._4_4_);
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar69 * auVar99._8_4_ | (uint)!bVar69 * auVar96._8_4_);
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar69 * auVar99._12_4_ | (uint)!bVar69 * auVar96._12_4_);
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar69 * auVar99._16_4_ | (uint)!bVar69 * auVar96._16_4_);
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar69 * auVar99._20_4_ | (uint)!bVar69 * auVar96._20_4_);
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar69 * auVar99._24_4_ | (uint)!bVar69 * auVar96._24_4_);
        bVar69 = SUB81(uVar62 >> 7,0);
        auVar105._28_4_ = (uint)bVar69 * auVar99._28_4_ | (uint)!bVar69 * auVar96._28_4_;
        auVar106._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar81._0_4_;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar69 * (int)auVar22._4_4_ | (uint)!bVar69 * auVar81._4_4_;
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar69 * (int)auVar22._8_4_ | (uint)!bVar69 * auVar81._8_4_;
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar69 * (int)auVar22._12_4_ | (uint)!bVar69 * auVar81._12_4_;
        auVar106._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar81._16_4_;
        auVar106._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar81._20_4_;
        auVar106._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar81._24_4_;
        auVar106._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar81._28_4_;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar107._0_4_ =
             (uint)(bVar63 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar78._0_4_;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar78._4_4_;
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar78._8_4_;
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar78._12_4_;
        auVar107._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_;
        auVar107._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_;
        auVar107._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
        auVar107._28_4_ = iVar2;
        auVar84 = vsubps_avx512vl(auVar106,auVar83);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar79._12_4_ |
                                                (uint)!bVar14 * auVar192._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar79._8_4_ |
                                                         (uint)!bVar13 * auVar192._8_4_,
                                                         CONCAT44((uint)bVar69 * (int)auVar79._4_4_
                                                                  | (uint)!bVar69 * auVar192._4_4_,
                                                                  (uint)(bVar63 & 1) *
                                                                  (int)auVar79._0_4_ |
                                                                  (uint)!(bool)(bVar63 & 1) *
                                                                  auVar192._0_4_)))),auVar94);
        auVar96 = vsubps_avx(auVar107,auVar93);
        auVar95 = vsubps_avx(auVar83,auVar103);
        auVar81 = vsubps_avx(auVar94,auVar104);
        auVar82 = vsubps_avx(auVar93,auVar105);
        auVar86._4_4_ = auVar96._4_4_ * fVar119;
        auVar86._0_4_ = auVar96._0_4_ * fVar71;
        auVar86._8_4_ = auVar96._8_4_ * fVar121;
        auVar86._12_4_ = auVar96._12_4_ * fVar124;
        auVar86._16_4_ = auVar96._16_4_ * 0.0;
        auVar86._20_4_ = auVar96._20_4_ * 0.0;
        auVar86._24_4_ = auVar96._24_4_ * 0.0;
        auVar86._28_4_ = iVar2;
        auVar76 = vfmsub231ps_fma(auVar86,auVar93,auVar84);
        auVar87._4_4_ = fVar120 * auVar84._4_4_;
        auVar87._0_4_ = fVar72 * auVar84._0_4_;
        auVar87._8_4_ = fVar122 * auVar84._8_4_;
        auVar87._12_4_ = fVar125 * auVar84._12_4_;
        auVar87._16_4_ = auVar84._16_4_ * 0.0;
        auVar87._20_4_ = auVar84._20_4_ * 0.0;
        auVar87._24_4_ = auVar84._24_4_ * 0.0;
        auVar87._28_4_ = auVar97._28_4_;
        auVar130 = vfmsub231ps_fma(auVar87,auVar83,auVar99);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar130),auVar88,ZEXT1632(auVar76));
        auVar157._0_4_ = auVar99._0_4_ * auVar93._0_4_;
        auVar157._4_4_ = auVar99._4_4_ * auVar93._4_4_;
        auVar157._8_4_ = auVar99._8_4_ * auVar93._8_4_;
        auVar157._12_4_ = auVar99._12_4_ * auVar93._12_4_;
        auVar157._16_4_ = auVar99._16_4_ * fVar143;
        auVar157._20_4_ = auVar99._20_4_ * fVar154;
        auVar157._24_4_ = auVar99._24_4_ * fVar161;
        auVar157._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar157,auVar94,auVar96);
        auVar85 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar76));
        auVar97 = vmulps_avx512vl(auVar82,auVar103);
        auVar97 = vfmsub231ps_avx512vl(auVar97,auVar95,auVar105);
        auVar89._4_4_ = auVar81._4_4_ * auVar105._4_4_;
        auVar89._0_4_ = auVar81._0_4_ * auVar105._0_4_;
        auVar89._8_4_ = auVar81._8_4_ * auVar105._8_4_;
        auVar89._12_4_ = auVar81._12_4_ * auVar105._12_4_;
        auVar89._16_4_ = auVar81._16_4_ * auVar105._16_4_;
        auVar89._20_4_ = auVar81._20_4_ * auVar105._20_4_;
        auVar89._24_4_ = auVar81._24_4_ * auVar105._24_4_;
        auVar89._28_4_ = auVar105._28_4_;
        auVar76 = vfmsub231ps_fma(auVar89,auVar104,auVar82);
        auVar158._0_4_ = auVar104._0_4_ * auVar95._0_4_;
        auVar158._4_4_ = auVar104._4_4_ * auVar95._4_4_;
        auVar158._8_4_ = auVar104._8_4_ * auVar95._8_4_;
        auVar158._12_4_ = auVar104._12_4_ * auVar95._12_4_;
        auVar158._16_4_ = fVar162 * auVar95._16_4_;
        auVar158._20_4_ = fVar163 * auVar95._20_4_;
        auVar158._24_4_ = fVar153 * auVar95._24_4_;
        auVar158._28_4_ = 0;
        auVar130 = vfmsub231ps_fma(auVar158,auVar81,auVar103);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar130),auVar88,auVar97);
        auVar86 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar76));
        auVar97 = vmaxps_avx(auVar85,auVar86);
        uVar134 = vcmpps_avx512vl(auVar97,auVar88,2);
        local_2f0 = local_2f0 & (byte)uVar134;
        in_ZMM20 = ZEXT3264(local_440);
        in_ZMM21 = ZEXT3264(local_460);
        auVar191 = ZEXT3264(local_400);
        auVar189 = ZEXT3264(local_4e0);
        auVar186 = ZEXT1664(auVar77);
        if (local_2f0 == 0) {
          local_2f0 = 0;
          auVar171 = ZEXT3264(auVar109);
          auVar142 = ZEXT3264(auVar108);
        }
        else {
          auVar33._4_4_ = auVar82._4_4_ * auVar99._4_4_;
          auVar33._0_4_ = auVar82._0_4_ * auVar99._0_4_;
          auVar33._8_4_ = auVar82._8_4_ * auVar99._8_4_;
          auVar33._12_4_ = auVar82._12_4_ * auVar99._12_4_;
          auVar33._16_4_ = auVar82._16_4_ * auVar99._16_4_;
          auVar33._20_4_ = auVar82._20_4_ * auVar99._20_4_;
          auVar33._24_4_ = auVar82._24_4_ * auVar99._24_4_;
          auVar33._28_4_ = auVar97._28_4_;
          auVar192 = vfmsub231ps_fma(auVar33,auVar81,auVar96);
          auVar34._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar34._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar34._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar34._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar34._16_4_ = auVar96._16_4_ * auVar95._16_4_;
          auVar34._20_4_ = auVar96._20_4_ * auVar95._20_4_;
          auVar34._24_4_ = auVar96._24_4_ * auVar95._24_4_;
          auVar34._28_4_ = auVar96._28_4_;
          auVar130 = vfmsub231ps_fma(auVar34,auVar84,auVar82);
          auVar35._4_4_ = auVar81._4_4_ * auVar84._4_4_;
          auVar35._0_4_ = auVar81._0_4_ * auVar84._0_4_;
          auVar35._8_4_ = auVar81._8_4_ * auVar84._8_4_;
          auVar35._12_4_ = auVar81._12_4_ * auVar84._12_4_;
          auVar35._16_4_ = auVar81._16_4_ * auVar84._16_4_;
          auVar35._20_4_ = auVar81._20_4_ * auVar84._20_4_;
          auVar35._24_4_ = auVar81._24_4_ * auVar84._24_4_;
          auVar35._28_4_ = auVar81._28_4_;
          auVar78 = vfmsub231ps_fma(auVar35,auVar95,auVar99);
          auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar130),ZEXT1632(auVar78));
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar192),auVar88);
          auVar99 = vrcp14ps_avx512vl(auVar97);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar26);
          auVar76 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
          auVar36._4_4_ = auVar78._4_4_ * auVar93._4_4_;
          auVar36._0_4_ = auVar78._0_4_ * auVar93._0_4_;
          auVar36._8_4_ = auVar78._8_4_ * auVar93._8_4_;
          auVar36._12_4_ = auVar78._12_4_ * auVar93._12_4_;
          auVar36._16_4_ = fVar143 * 0.0;
          auVar36._20_4_ = fVar154 * 0.0;
          auVar36._24_4_ = fVar161 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar130 = vfmadd231ps_fma(auVar36,auVar94,ZEXT1632(auVar130));
          auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar83,ZEXT1632(auVar192));
          fVar154 = auVar76._0_4_;
          fVar161 = auVar76._4_4_;
          fVar162 = auVar76._8_4_;
          fVar163 = auVar76._12_4_;
          auVar99 = ZEXT1632(CONCAT412(auVar130._12_4_ * fVar163,
                                       CONCAT48(auVar130._8_4_ * fVar162,
                                                CONCAT44(auVar130._4_4_ * fVar161,
                                                         auVar130._0_4_ * fVar154))));
          auVar142 = ZEXT3264(auVar99);
          auVar176._4_4_ = uVar67;
          auVar176._0_4_ = uVar67;
          auVar176._8_4_ = uVar67;
          auVar176._12_4_ = uVar67;
          auVar176._16_4_ = uVar67;
          auVar176._20_4_ = uVar67;
          auVar176._24_4_ = uVar67;
          auVar176._28_4_ = uVar67;
          uVar134 = vcmpps_avx512vl(auVar176,auVar99,2);
          fVar143 = ray->tfar;
          auVar27._4_4_ = fVar143;
          auVar27._0_4_ = fVar143;
          auVar27._8_4_ = fVar143;
          auVar27._12_4_ = fVar143;
          auVar27._16_4_ = fVar143;
          auVar27._20_4_ = fVar143;
          auVar27._24_4_ = fVar143;
          auVar27._28_4_ = fVar143;
          uVar23 = vcmpps_avx512vl(auVar99,auVar27,2);
          local_2f0 = (byte)uVar134 & (byte)uVar23 & local_2f0;
          if (local_2f0 == 0) {
            local_2f0 = 0;
            auVar171 = ZEXT3264(auVar109);
            auVar142 = ZEXT3264(auVar108);
          }
          else {
            uVar134 = vcmpps_avx512vl(auVar97,auVar88,4);
            if ((local_2f0 & (byte)uVar134) == 0) {
              local_2f0 = 0;
              auVar171 = ZEXT3264(auVar109);
              auVar142 = ZEXT3264(auVar108);
            }
            else {
              local_2f0 = local_2f0 & (byte)uVar134;
              fVar143 = auVar85._0_4_ * fVar154;
              fVar153 = auVar85._4_4_ * fVar161;
              auVar108._4_4_ = fVar153;
              auVar108._0_4_ = fVar143;
              fVar71 = auVar85._8_4_ * fVar162;
              auVar108._8_4_ = fVar71;
              fVar72 = auVar85._12_4_ * fVar163;
              auVar108._12_4_ = fVar72;
              fVar119 = auVar85._16_4_ * 0.0;
              auVar108._16_4_ = fVar119;
              fVar120 = auVar85._20_4_ * 0.0;
              auVar108._20_4_ = fVar120;
              fVar121 = auVar85._24_4_ * 0.0;
              auVar108._24_4_ = fVar121;
              auVar108._28_4_ = auVar85._28_4_;
              fVar154 = auVar86._0_4_ * fVar154;
              fVar161 = auVar86._4_4_ * fVar161;
              auVar109._4_4_ = fVar161;
              auVar109._0_4_ = fVar154;
              fVar162 = auVar86._8_4_ * fVar162;
              auVar109._8_4_ = fVar162;
              fVar163 = auVar86._12_4_ * fVar163;
              auVar109._12_4_ = fVar163;
              fVar122 = auVar86._16_4_ * 0.0;
              auVar109._16_4_ = fVar122;
              fVar124 = auVar86._20_4_ * 0.0;
              auVar109._20_4_ = fVar124;
              fVar125 = auVar86._24_4_ * 0.0;
              auVar109._24_4_ = fVar125;
              auVar109._28_4_ = auVar86._28_4_;
              auVar167._8_4_ = 0x3f800000;
              auVar167._0_8_ = &DAT_3f8000003f800000;
              auVar167._12_4_ = 0x3f800000;
              auVar167._16_4_ = 0x3f800000;
              auVar167._20_4_ = 0x3f800000;
              auVar167._24_4_ = 0x3f800000;
              auVar167._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar167,auVar108);
              bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar62 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar62 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
              bVar17 = SUB81(uVar62 >> 7,0);
              auVar171 = ZEXT3264(CONCAT428((uint)bVar17 * auVar85._28_4_ |
                                            (uint)!bVar17 * auVar108._28_4_,
                                            CONCAT424((uint)bVar16 * (int)fVar121 |
                                                      (uint)!bVar16 * auVar108._24_4_,
                                                      CONCAT420((uint)bVar15 * (int)fVar120 |
                                                                (uint)!bVar15 * auVar108._20_4_,
                                                                CONCAT416((uint)bVar14 *
                                                                          (int)fVar119 |
                                                                          (uint)!bVar14 *
                                                                          auVar108._16_4_,
                                                                          CONCAT412((uint)bVar13 *
                                                                                    (int)fVar72 |
                                                                                    (uint)!bVar13 *
                                                                                    auVar108._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar12 * (int)fVar71 |
                                                  (uint)!bVar12 * auVar108._8_4_,
                                                  CONCAT44((uint)bVar69 * (int)fVar153 |
                                                           (uint)!bVar69 * auVar108._4_4_,
                                                           (uint)(bVar63 & 1) * (int)fVar143 |
                                                           (uint)!(bool)(bVar63 & 1) *
                                                           auVar108._0_4_))))))));
              auVar108 = vsubps_avx(auVar167,auVar109);
              bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar62 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar62 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
              bVar17 = SUB81(uVar62 >> 7,0);
              local_240._4_4_ = (uint)bVar69 * (int)fVar161 | (uint)!bVar69 * auVar108._4_4_;
              local_240._0_4_ =
                   (uint)(bVar63 & 1) * (int)fVar154 | (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
              local_240._8_4_ = (uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar108._8_4_;
              local_240._12_4_ = (uint)bVar13 * (int)fVar163 | (uint)!bVar13 * auVar108._12_4_;
              local_240._16_4_ = (uint)bVar14 * (int)fVar122 | (uint)!bVar14 * auVar108._16_4_;
              local_240._20_4_ = (uint)bVar15 * (int)fVar124 | (uint)!bVar15 * auVar108._20_4_;
              local_240._24_4_ = (uint)bVar16 * (int)fVar125 | (uint)!bVar16 * auVar108._24_4_;
              local_240._28_4_ = (uint)bVar17 * auVar86._28_4_ | (uint)!bVar17 * auVar108._28_4_;
            }
          }
        }
        auVar181 = ZEXT1664(local_610);
        if (local_2f0 != 0) {
          auVar108 = vsubps_avx(ZEXT1632(auVar19),auVar91);
          local_5c0 = auVar171._0_32_;
          auVar76 = vfmadd213ps_fma(auVar108,local_5c0,auVar91);
          fVar143 = pre->depth_scale;
          auVar91._4_4_ = fVar143;
          auVar91._0_4_ = fVar143;
          auVar91._8_4_ = fVar143;
          auVar91._12_4_ = fVar143;
          auVar91._16_4_ = fVar143;
          auVar91._20_4_ = fVar143;
          auVar91._24_4_ = fVar143;
          auVar91._28_4_ = fVar143;
          auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                        CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                 CONCAT44(auVar76._4_4_ +
                                                                          auVar76._4_4_,
                                                                          auVar76._0_4_ +
                                                                          auVar76._0_4_)))),auVar91)
          ;
          local_5e0 = auVar142._0_32_;
          uVar134 = vcmpps_avx512vl(local_5e0,auVar108,6);
          local_2f0 = local_2f0 & (byte)uVar134;
          if (local_2f0 != 0) {
            auVar131._8_4_ = 0xbf800000;
            auVar131._0_8_ = 0xbf800000bf800000;
            auVar131._12_4_ = 0xbf800000;
            auVar131._16_4_ = 0xbf800000;
            auVar131._20_4_ = 0xbf800000;
            auVar131._24_4_ = 0xbf800000;
            auVar131._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_380 = vfmadd132ps_avx512vl(local_240,auVar131,auVar28);
            local_240 = local_380;
            auVar108 = local_240;
            local_340 = 0;
            if ((pGVar66->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar69 = true, pGVar66->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar143 = 1.0 / auVar92._0_4_;
                local_2e0[0] = fVar143 * (auVar171._0_4_ + 0.0);
                local_2e0[1] = fVar143 * (auVar171._4_4_ + 1.0);
                local_2e0[2] = fVar143 * (auVar171._8_4_ + 2.0);
                local_2e0[3] = fVar143 * (auVar171._12_4_ + 3.0);
                fStack_2d0 = fVar143 * (auVar171._16_4_ + 4.0);
                fStack_2cc = fVar143 * (auVar171._20_4_ + 5.0);
                fStack_2c8 = fVar143 * (auVar171._24_4_ + 6.0);
                fStack_2c4 = auVar171._28_4_ + 7.0;
                local_240._0_8_ = local_380._0_8_;
                local_240._8_8_ = local_380._8_8_;
                local_240._16_8_ = local_380._16_8_;
                local_240._24_8_ = local_380._24_8_;
                local_2c0 = local_240._0_8_;
                uStack_2b8 = local_240._8_8_;
                uStack_2b0 = local_240._16_8_;
                uStack_2a8 = local_240._24_8_;
                local_2a0 = local_5e0;
                local_4a0 = (float)local_4f0;
                uStack_49c = (undefined4)((ulong)local_4f0 >> 0x20);
                lVar68 = 0;
                uVar65 = (ulong)local_2f0;
                for (uVar62 = uVar65; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000)
                {
                  lVar68 = lVar68 + 1;
                }
                bVar69 = true;
                local_530 = local_490;
                uStack_528 = uStack_488;
                uStack_518 = uStack_4f8;
                local_510 = auVar77;
                uStack_498 = uStack_4e8;
                local_3a0 = local_5c0;
                local_360 = local_5e0;
                local_33c = iVar10;
                local_330 = local_610;
                local_320 = local_4f0;
                uStack_318 = uStack_4e8;
                local_310 = local_520;
                uStack_308 = uStack_4f8;
                local_300 = local_490;
                uStack_2f8 = uStack_488;
                local_240 = auVar108;
                do {
                  auVar192 = auVar193._0_16_;
                  local_564 = local_2e0[lVar68];
                  local_560 = *(undefined4 *)((long)&local_2c0 + lVar68 * 4);
                  local_5f0 = CONCAT44(local_5f0._4_4_,ray->tfar);
                  local_280 = (uint)lVar68;
                  uStack_27c = (uint)((ulong)lVar68 >> 0x20);
                  ray->tfar = *(float *)(local_2a0 + lVar68 * 4);
                  local_5a0.context = context->user;
                  fVar143 = 1.0 - local_564;
                  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(local_564 * (fVar143 + fVar143))),
                                             ZEXT416((uint)fVar143),ZEXT416((uint)fVar143));
                  auVar130 = ZEXT416((uint)local_564);
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                            ZEXT416(0xc0a00000));
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(local_564 * local_564 * 3.0)),
                                            ZEXT416((uint)(local_564 + local_564)),auVar77);
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                            ZEXT416(0x40000000));
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * fVar143 * -3.0)),
                                            ZEXT416((uint)(fVar143 + fVar143)),auVar77);
                  auVar130 = vfmadd231ss_fma(ZEXT416((uint)(local_564 * local_564)),auVar130,
                                             ZEXT416((uint)(fVar143 * -2.0)));
                  fVar143 = auVar19._0_4_ * 0.5;
                  fVar154 = auVar76._0_4_ * 0.5;
                  fVar161 = auVar77._0_4_ * 0.5;
                  fVar162 = auVar130._0_4_ * 0.5;
                  auVar148._0_4_ = fVar162 * (float)local_530;
                  auVar148._4_4_ = fVar162 * local_530._4_4_;
                  auVar148._8_4_ = fVar162 * (float)uStack_528;
                  auVar148._12_4_ = fVar162 * uStack_528._4_4_;
                  auVar165._4_4_ = fVar161;
                  auVar165._0_4_ = fVar161;
                  auVar165._8_4_ = fVar161;
                  auVar165._12_4_ = fVar161;
                  auVar56._8_8_ = uStack_518;
                  auVar56._0_8_ = local_520;
                  auVar77 = vfmadd132ps_fma(auVar165,auVar148,auVar56);
                  auVar149._4_4_ = fVar154;
                  auVar149._0_4_ = fVar154;
                  auVar149._8_4_ = fVar154;
                  auVar149._12_4_ = fVar154;
                  auVar57._4_4_ = uStack_49c;
                  auVar57._0_4_ = local_4a0;
                  auVar57._8_8_ = uStack_498;
                  auVar77 = vfmadd132ps_fma(auVar149,auVar77,auVar57);
                  auVar140._4_4_ = fVar143;
                  auVar140._0_4_ = fVar143;
                  auVar140._8_4_ = fVar143;
                  auVar140._12_4_ = fVar143;
                  auVar77 = vfmadd213ps_fma(auVar140,auVar181._0_16_,auVar77);
                  local_570 = vmovlps_avx(auVar77);
                  local_568 = vextractps_avx(auVar77,2);
                  local_55c = (undefined4)local_538;
                  local_558 = (undefined4)local_5e8;
                  local_554 = (local_5a0.context)->instID[0];
                  local_550 = (local_5a0.context)->instPrimID[0];
                  local_624 = -1;
                  local_5a0.valid = &local_624;
                  local_5a0.geometryUserPtr = pGVar66->userPtr;
                  local_5a0.hit = (RTCHitN *)&local_570;
                  local_5a0.N = 1;
                  local_3e0 = (float)uVar65;
                  fStack_3dc = (float)(uVar65 >> 0x20);
                  local_5a0.ray = (RTCRayN *)ray;
                  if (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b60d3c:
                    auVar77 = auVar193._0_16_;
                    p_Var11 = context->args->filter;
                    fVar143 = auVar186._0_4_;
                    if (p_Var11 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar66->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var11)(&local_5a0);
                      auVar186 = ZEXT1664(local_510);
                      auVar189 = ZEXT3264(local_4e0);
                      auVar190 = ZEXT3264(local_4c0);
                      auVar191 = ZEXT3264(local_400);
                      auVar181 = ZEXT1664(local_610);
                      in_ZMM21 = ZEXT3264(local_460);
                      in_ZMM20 = ZEXT3264(local_440);
                      auVar77 = vxorps_avx512vl(auVar77,auVar77);
                      auVar193 = ZEXT1664(auVar77);
                      context = local_618;
                      ray = local_620;
                      pre = local_5f8;
                      uVar67 = local_480._0_4_;
                    }
                    uVar65 = CONCAT44(fStack_3dc,local_3e0);
                    fVar143 = auVar186._0_4_;
                    if (*local_5a0.valid != 0) break;
                  }
                  else {
                    (*pGVar66->occlusionFilterN)(&local_5a0);
                    uVar65 = CONCAT44(fStack_3dc,local_3e0);
                    auVar186 = ZEXT1664(local_510);
                    auVar189 = ZEXT3264(local_4e0);
                    auVar190 = ZEXT3264(local_4c0);
                    auVar191 = ZEXT3264(local_400);
                    auVar181 = ZEXT1664(local_610);
                    in_ZMM21 = ZEXT3264(local_460);
                    in_ZMM20 = ZEXT3264(local_440);
                    auVar77 = vxorps_avx512vl(auVar192,auVar192);
                    auVar193 = ZEXT1664(auVar77);
                    context = local_618;
                    ray = local_620;
                    pre = local_5f8;
                    uVar67 = local_480._0_4_;
                    if (*local_5a0.valid != 0) goto LAB_01b60d3c;
                  }
                  ray->tfar = (float)local_5f0;
                  lVar68 = 0;
                  uVar65 = uVar65 ^ 1L << ((ulong)local_280 & 0x3f);
                  for (uVar62 = uVar65; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000
                      ) {
                    lVar68 = lVar68 + 1;
                  }
                  bVar69 = uVar65 != 0;
                  fVar143 = auVar186._0_4_;
                } while (bVar69);
                local_3e0 = fVar143;
                auVar171 = ZEXT3264(local_5c0);
                auVar142 = ZEXT3264(local_5e0);
                local_618 = context;
                local_620 = ray;
                local_5f8 = pre;
              }
              goto LAB_01b60e74;
            }
          }
        }
        bVar69 = false;
      }
LAB_01b60e74:
      if (8 < iVar10) {
        local_480 = vpbroadcastd_avx512vl();
        local_280 = uVar67;
        uStack_27c = uVar67;
        uStack_278 = uVar67;
        uStack_274 = uVar67;
        uStack_270 = uVar67;
        uStack_26c = uVar67;
        uStack_268 = uVar67;
        uStack_264 = uVar67;
        fStack_3b0 = 1.0 / local_3c0;
        auStack_3bc._0_4_ = fStack_3b0;
        local_3c0 = fStack_3b0;
        auStack_3bc._4_4_ = fStack_3b0;
        fStack_3b4 = fStack_3b0;
        lVar68 = 8;
        local_5c0 = auVar171._0_32_;
        local_5e0 = auVar142._0_32_;
        fStack_3dc = local_3e0;
        fStack_3d8 = local_3e0;
        fStack_3d4 = local_3e0;
        fStack_3d0 = local_3e0;
        fStack_3cc = local_3e0;
        fStack_3c8 = local_3e0;
        fStack_3c4 = local_3e0;
        fStack_3ac = fStack_3b0;
        fStack_3a8 = fStack_3b0;
        fStack_3a4 = fStack_3b0;
        do {
          auVar108 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar108,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar96,local_480,1);
          auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar68 * 4 + lVar24);
          auVar109 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar68 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar68 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar68 * 4);
          auVar95 = vmulps_avx512vl(local_140,auVar99);
          auVar81 = vmulps_avx512vl(local_160,auVar99);
          auVar37._4_4_ = auVar99._4_4_ * (float)local_180._4_4_;
          auVar37._0_4_ = auVar99._0_4_ * (float)local_180._0_4_;
          auVar37._8_4_ = auVar99._8_4_ * fStack_178;
          auVar37._12_4_ = auVar99._12_4_ * fStack_174;
          auVar37._16_4_ = auVar99._16_4_ * fStack_170;
          auVar37._20_4_ = auVar99._20_4_ * fStack_16c;
          auVar37._24_4_ = auVar99._24_4_ * fStack_168;
          auVar37._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar95,auVar97,local_e0);
          auVar95 = vfmadd231ps_avx512vl(auVar81,auVar97,local_100);
          auVar81 = vfmadd231ps_avx512vl(auVar37,auVar97,local_120);
          auVar91 = auVar189._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,auVar91);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_a0);
          auVar77 = vfmadd231ps_fma(auVar81,auVar109,local_c0);
          auVar93 = auVar191._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar93);
          auVar92 = auVar190._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar95,auVar108,auVar92);
          auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar68 * 4 + lVar24);
          auVar95 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar68 * 4);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar108,local_80);
          auVar81 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar68 * 4);
          auVar82 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar68 * 4);
          auVar83 = vmulps_avx512vl(local_140,auVar82);
          auVar94 = vmulps_avx512vl(local_160,auVar82);
          auVar38._4_4_ = auVar82._4_4_ * (float)local_180._4_4_;
          auVar38._0_4_ = auVar82._0_4_ * (float)local_180._0_4_;
          auVar38._8_4_ = auVar82._8_4_ * fStack_178;
          auVar38._12_4_ = auVar82._12_4_ * fStack_174;
          auVar38._16_4_ = auVar82._16_4_ * fStack_170;
          auVar38._20_4_ = auVar82._20_4_ * fStack_16c;
          auVar38._24_4_ = auVar82._24_4_ * fStack_168;
          auVar38._28_4_ = uStack_164;
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,local_e0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar81,local_100);
          auVar86 = vfmadd231ps_avx512vl(auVar38,auVar81,local_120);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar91);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar95,local_a0);
          auVar76 = vfmadd231ps_fma(auVar86,auVar95,local_c0);
          auVar86 = vfmadd231ps_avx512vl(auVar83,auVar96,auVar93);
          auVar87 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar92);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar96,local_80);
          auVar88 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar76));
          auVar83 = vsubps_avx(auVar86,auVar84);
          auVar94 = vsubps_avx(auVar87,auVar85);
          auVar89 = vmulps_avx512vl(auVar85,auVar83);
          auVar90 = vmulps_avx512vl(auVar84,auVar94);
          auVar89 = vsubps_avx512vl(auVar89,auVar90);
          auVar90 = vmulps_avx512vl(auVar94,auVar94);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar83,auVar83);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar90);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          uVar134 = vcmpps_avx512vl(auVar89,auVar88,2);
          local_2f0 = (byte)uVar23 & (byte)uVar134;
          if (local_2f0 == 0) {
            auVar171 = ZEXT3264(local_5c0);
            auVar142 = ZEXT3264(local_5e0);
            auVar190 = ZEXT3264(auVar92);
            auVar189 = ZEXT3264(auVar91);
          }
          else {
            auVar82 = vmulps_avx512vl(local_420,auVar82);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_1e0,auVar82);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_1c0,auVar81);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_1a0,auVar95);
            auVar99 = vmulps_avx512vl(local_420,auVar99);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_1e0,auVar99);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_1c0,auVar97);
            auVar95 = vfmadd213ps_avx512vl(auVar108,local_1a0,auVar109);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar68 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar68 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar68 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar68 * 4);
            auVar81 = vmulps_avx512vl(local_140,auVar99);
            auVar82 = vmulps_avx512vl(local_160,auVar99);
            auVar99 = vmulps_avx512vl(local_420,auVar99);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,local_e0);
            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar97,local_100);
            auVar97 = vfmadd231ps_avx512vl(auVar99,local_1e0,auVar97);
            auVar99 = vfmadd231ps_avx512vl(auVar81,auVar109,auVar91);
            auVar81 = vfmadd231ps_avx512vl(auVar82,auVar109,local_a0);
            auVar109 = vfmadd231ps_avx512vl(auVar97,local_1c0,auVar109);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,auVar93);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar108,auVar92);
            auVar82 = vfmadd231ps_avx512vl(auVar109,local_1a0,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar68 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar68 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar68 * 4);
            auVar88 = vmulps_avx512vl(local_140,auVar97);
            auVar89 = vmulps_avx512vl(local_160,auVar97);
            auVar97 = vmulps_avx512vl(local_420,auVar97);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar109,local_e0);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar109,local_100);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_1e0,auVar109);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar68 * 4);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar109,auVar91);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar109,local_a0);
            auVar109 = vfmadd231ps_avx512vl(auVar97,local_1c0,auVar109);
            auVar97 = vfmadd231ps_avx512vl(auVar88,auVar108,auVar93);
            auVar88 = vfmadd231ps_avx512vl(auVar89,auVar108,auVar92);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_1a0,auVar108);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar99,auVar89);
            vandps_avx512vl(auVar81,auVar89);
            auVar108 = vmaxps_avx(auVar89,auVar89);
            vandps_avx512vl(auVar82,auVar89);
            auVar108 = vmaxps_avx(auVar108,auVar89);
            auVar58._4_4_ = fStack_3dc;
            auVar58._0_4_ = local_3e0;
            auVar58._8_4_ = fStack_3d8;
            auVar58._12_4_ = fStack_3d4;
            auVar58._16_4_ = fStack_3d0;
            auVar58._20_4_ = fStack_3cc;
            auVar58._24_4_ = fStack_3c8;
            auVar58._28_4_ = fStack_3c4;
            uVar62 = vcmpps_avx512vl(auVar108,auVar58,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar110._0_4_ = (float)((uint)bVar12 * auVar83._0_4_ | (uint)!bVar12 * auVar99._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar99._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar99._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar99._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar12 * auVar83._16_4_ | (uint)!bVar12 * auVar99._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar12 * auVar83._20_4_ | (uint)!bVar12 * auVar99._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar12 * auVar83._24_4_ | (uint)!bVar12 * auVar99._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar83._28_4_ | (uint)!bVar12 * auVar99._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar81._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar81._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar81._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar81._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar81._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar81._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar81._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar81._28_4_;
            vandps_avx512vl(auVar97,auVar89);
            vandps_avx512vl(auVar88,auVar89);
            auVar108 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar109,auVar89);
            auVar108 = vmaxps_avx(auVar108,auVar111);
            uVar62 = vcmpps_avx512vl(auVar108,auVar58,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar112._0_4_ = (uint)bVar12 * auVar83._0_4_ | (uint)!bVar12 * auVar97._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar97._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar97._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar97._12_4_;
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar112._16_4_ = (uint)bVar12 * auVar83._16_4_ | (uint)!bVar12 * auVar97._16_4_;
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar112._20_4_ = (uint)bVar12 * auVar83._20_4_ | (uint)!bVar12 * auVar97._20_4_;
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar112._24_4_ = (uint)bVar12 * auVar83._24_4_ | (uint)!bVar12 * auVar97._24_4_;
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar83._28_4_ | (uint)!bVar12 * auVar97._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar113._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar88._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar88._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar88._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar88._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar88._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar88._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar88._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar113._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar88._28_4_;
            auVar180._8_4_ = 0x80000000;
            auVar180._0_8_ = 0x8000000080000000;
            auVar180._12_4_ = 0x80000000;
            auVar180._16_4_ = 0x80000000;
            auVar180._20_4_ = 0x80000000;
            auVar180._24_4_ = 0x80000000;
            auVar180._28_4_ = 0x80000000;
            auVar108 = vxorps_avx512vl(auVar112,auVar180);
            auVar88 = auVar193._0_32_;
            auVar109 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar88);
            auVar130 = vfmadd231ps_fma(auVar109,auVar111,auVar111);
            auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar130));
            auVar188._8_4_ = 0xbf000000;
            auVar188._0_8_ = 0xbf000000bf000000;
            auVar188._12_4_ = 0xbf000000;
            auVar188._16_4_ = 0xbf000000;
            auVar188._20_4_ = 0xbf000000;
            auVar188._24_4_ = 0xbf000000;
            auVar188._28_4_ = 0xbf000000;
            fVar143 = auVar109._0_4_;
            fVar154 = auVar109._4_4_;
            fVar161 = auVar109._8_4_;
            fVar162 = auVar109._12_4_;
            fVar163 = auVar109._16_4_;
            fVar153 = auVar109._20_4_;
            fVar71 = auVar109._24_4_;
            auVar39._4_4_ = fVar154 * fVar154 * fVar154 * auVar130._4_4_ * -0.5;
            auVar39._0_4_ = fVar143 * fVar143 * fVar143 * auVar130._0_4_ * -0.5;
            auVar39._8_4_ = fVar161 * fVar161 * fVar161 * auVar130._8_4_ * -0.5;
            auVar39._12_4_ = fVar162 * fVar162 * fVar162 * auVar130._12_4_ * -0.5;
            auVar39._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar39._20_4_ = fVar153 * fVar153 * fVar153 * -0.0;
            auVar39._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
            auVar39._28_4_ = auVar111._28_4_;
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar109 = vfmadd231ps_avx512vl(auVar39,auVar97,auVar109);
            auVar40._4_4_ = auVar111._4_4_ * auVar109._4_4_;
            auVar40._0_4_ = auVar111._0_4_ * auVar109._0_4_;
            auVar40._8_4_ = auVar111._8_4_ * auVar109._8_4_;
            auVar40._12_4_ = auVar111._12_4_ * auVar109._12_4_;
            auVar40._16_4_ = auVar111._16_4_ * auVar109._16_4_;
            auVar40._20_4_ = auVar111._20_4_ * auVar109._20_4_;
            auVar40._24_4_ = auVar111._24_4_ * auVar109._24_4_;
            auVar40._28_4_ = 0;
            auVar41._4_4_ = auVar109._4_4_ * -auVar110._4_4_;
            auVar41._0_4_ = auVar109._0_4_ * -auVar110._0_4_;
            auVar41._8_4_ = auVar109._8_4_ * -auVar110._8_4_;
            auVar41._12_4_ = auVar109._12_4_ * -auVar110._12_4_;
            auVar41._16_4_ = auVar109._16_4_ * -auVar110._16_4_;
            auVar41._20_4_ = auVar109._20_4_ * -auVar110._20_4_;
            auVar41._24_4_ = auVar109._24_4_ * -auVar110._24_4_;
            auVar41._28_4_ = auVar111._28_4_;
            auVar99 = vmulps_avx512vl(auVar109,auVar88);
            auVar109 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar88);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar113);
            auVar81 = vrsqrt14ps_avx512vl(auVar109);
            auVar109 = vmulps_avx512vl(auVar109,auVar188);
            fVar143 = auVar81._0_4_;
            fVar154 = auVar81._4_4_;
            fVar161 = auVar81._8_4_;
            fVar162 = auVar81._12_4_;
            fVar163 = auVar81._16_4_;
            fVar153 = auVar81._20_4_;
            fVar71 = auVar81._24_4_;
            auVar42._4_4_ = fVar154 * fVar154 * fVar154 * auVar109._4_4_;
            auVar42._0_4_ = fVar143 * fVar143 * fVar143 * auVar109._0_4_;
            auVar42._8_4_ = fVar161 * fVar161 * fVar161 * auVar109._8_4_;
            auVar42._12_4_ = fVar162 * fVar162 * fVar162 * auVar109._12_4_;
            auVar42._16_4_ = fVar163 * fVar163 * fVar163 * auVar109._16_4_;
            auVar42._20_4_ = fVar153 * fVar153 * fVar153 * auVar109._20_4_;
            auVar42._24_4_ = fVar71 * fVar71 * fVar71 * auVar109._24_4_;
            auVar42._28_4_ = auVar109._28_4_;
            auVar109 = vfmadd231ps_avx512vl(auVar42,auVar97,auVar81);
            auVar43._4_4_ = auVar113._4_4_ * auVar109._4_4_;
            auVar43._0_4_ = auVar113._0_4_ * auVar109._0_4_;
            auVar43._8_4_ = auVar113._8_4_ * auVar109._8_4_;
            auVar43._12_4_ = auVar113._12_4_ * auVar109._12_4_;
            auVar43._16_4_ = auVar113._16_4_ * auVar109._16_4_;
            auVar43._20_4_ = auVar113._20_4_ * auVar109._20_4_;
            auVar43._24_4_ = auVar113._24_4_ * auVar109._24_4_;
            auVar43._28_4_ = auVar81._28_4_;
            auVar44._4_4_ = auVar109._4_4_ * auVar108._4_4_;
            auVar44._0_4_ = auVar109._0_4_ * auVar108._0_4_;
            auVar44._8_4_ = auVar109._8_4_ * auVar108._8_4_;
            auVar44._12_4_ = auVar109._12_4_ * auVar108._12_4_;
            auVar44._16_4_ = auVar109._16_4_ * auVar108._16_4_;
            auVar44._20_4_ = auVar109._20_4_ * auVar108._20_4_;
            auVar44._24_4_ = auVar109._24_4_ * auVar108._24_4_;
            auVar44._28_4_ = auVar108._28_4_;
            auVar108 = vmulps_avx512vl(auVar109,auVar88);
            auVar130 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar77),auVar84);
            auVar109 = ZEXT1632(auVar77);
            auVar19 = vfmadd213ps_fma(auVar41,auVar109,auVar85);
            auVar97 = vfmadd213ps_avx512vl(auVar99,auVar109,auVar95);
            auVar81 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar76),auVar86);
            auVar22 = vfnmadd213ps_fma(auVar40,auVar109,auVar84);
            auVar82 = ZEXT1632(auVar76);
            auVar192 = vfmadd213ps_fma(auVar44,auVar82,auVar87);
            auVar79 = vfnmadd213ps_fma(auVar41,auVar109,auVar85);
            auVar78 = vfmadd213ps_fma(auVar108,auVar82,auVar96);
            auVar85 = ZEXT1632(auVar77);
            auVar74 = vfnmadd231ps_fma(auVar95,auVar85,auVar99);
            auVar73 = vfnmadd213ps_fma(auVar43,auVar82,auVar86);
            auVar75 = vfnmadd213ps_fma(auVar44,auVar82,auVar87);
            auVar80 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar76),auVar108);
            auVar96 = vsubps_avx512vl(auVar81,ZEXT1632(auVar22));
            auVar108 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar79));
            auVar109 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar74));
            auVar45._4_4_ = auVar108._4_4_ * auVar74._4_4_;
            auVar45._0_4_ = auVar108._0_4_ * auVar74._0_4_;
            auVar45._8_4_ = auVar108._8_4_ * auVar74._8_4_;
            auVar45._12_4_ = auVar108._12_4_ * auVar74._12_4_;
            auVar45._16_4_ = auVar108._16_4_ * 0.0;
            auVar45._20_4_ = auVar108._20_4_ * 0.0;
            auVar45._24_4_ = auVar108._24_4_ * 0.0;
            auVar45._28_4_ = auVar99._28_4_;
            auVar77 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar79),auVar109);
            auVar46._4_4_ = auVar109._4_4_ * auVar22._4_4_;
            auVar46._0_4_ = auVar109._0_4_ * auVar22._0_4_;
            auVar46._8_4_ = auVar109._8_4_ * auVar22._8_4_;
            auVar46._12_4_ = auVar109._12_4_ * auVar22._12_4_;
            auVar46._16_4_ = auVar109._16_4_ * 0.0;
            auVar46._20_4_ = auVar109._20_4_ * 0.0;
            auVar46._24_4_ = auVar109._24_4_ * 0.0;
            auVar46._28_4_ = auVar109._28_4_;
            auVar20 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar74),auVar96);
            auVar47._4_4_ = auVar79._4_4_ * auVar96._4_4_;
            auVar47._0_4_ = auVar79._0_4_ * auVar96._0_4_;
            auVar47._8_4_ = auVar79._8_4_ * auVar96._8_4_;
            auVar47._12_4_ = auVar79._12_4_ * auVar96._12_4_;
            auVar47._16_4_ = auVar96._16_4_ * 0.0;
            auVar47._20_4_ = auVar96._20_4_ * 0.0;
            auVar47._24_4_ = auVar96._24_4_ * 0.0;
            auVar47._28_4_ = auVar96._28_4_;
            auVar21 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar22),auVar108);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar88,ZEXT1632(auVar20));
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar88,ZEXT1632(auVar77));
            uVar62 = vcmpps_avx512vl(auVar108,auVar88,2);
            bVar63 = (byte)uVar62;
            fVar120 = (float)((uint)(bVar63 & 1) * auVar130._0_4_ |
                             (uint)!(bool)(bVar63 & 1) * auVar73._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar122 = (float)((uint)bVar12 * auVar130._4_4_ | (uint)!bVar12 * auVar73._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar125 = (float)((uint)bVar12 * auVar130._8_4_ | (uint)!bVar12 * auVar73._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar126 = (float)((uint)bVar12 * auVar130._12_4_ | (uint)!bVar12 * auVar73._12_4_);
            auVar82 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar125,CONCAT44(fVar122,fVar120))));
            fVar121 = (float)((uint)(bVar63 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar63 & 1) * auVar75._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar124 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar75._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar123 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar75._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar127 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar75._12_4_);
            auVar83 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar123,CONCAT44(fVar124,fVar121))));
            auVar114._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar80._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar80._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar80._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar80._12_4_);
            fVar154 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
            auVar114._16_4_ = fVar154;
            fVar161 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
            auVar114._20_4_ = fVar161;
            fVar143 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
            auVar114._24_4_ = fVar143;
            iVar1 = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
            auVar114._28_4_ = iVar1;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar81);
            auVar115._0_4_ =
                 (uint)(bVar63 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar77._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar77._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar77._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar77._12_4_;
            auVar115._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_;
            auVar115._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_;
            auVar115._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_;
            auVar115._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar192));
            auVar116._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar130._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar130._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar130._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar130._12_4_);
            fVar162 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_);
            auVar116._16_4_ = fVar162;
            fVar163 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_);
            auVar116._20_4_ = fVar163;
            fVar153 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_);
            auVar116._24_4_ = fVar153;
            auVar116._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar78));
            auVar117._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar71 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_);
            auVar117._16_4_ = fVar71;
            fVar72 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_);
            auVar117._20_4_ = fVar72;
            fVar119 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_);
            auVar117._24_4_ = fVar119;
            iVar2 = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
            auVar117._28_4_ = iVar2;
            auVar118._0_4_ =
                 (uint)(bVar63 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar81._0_4_
            ;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar12 * (int)auVar22._4_4_ | (uint)!bVar12 * auVar81._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar12 * (int)auVar22._8_4_ | (uint)!bVar12 * auVar81._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar12 * (int)auVar22._12_4_ | (uint)!bVar12 * auVar81._12_4_;
            auVar118._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar81._16_4_;
            auVar118._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar81._20_4_;
            auVar118._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar81._24_4_;
            auVar118._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar81._28_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar81 = vsubps_avx512vl(auVar118,auVar82);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar79._12_4_ |
                                                     (uint)!bVar16 * auVar192._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar79._8_4_ |
                                                              (uint)!bVar14 * auVar192._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar79._4_4_ |
                                                                       (uint)!bVar12 *
                                                                       auVar192._4_4_,
                                                                       (uint)(bVar63 & 1) *
                                                                       (int)auVar79._0_4_ |
                                                                       (uint)!(bool)(bVar63 & 1) *
                                                                       auVar192._0_4_)))),auVar83);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar74._12_4_ |
                                                    (uint)!bVar17 * auVar78._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar74._8_4_ |
                                                             (uint)!bVar15 * auVar78._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar74._4_4_ |
                                                                      (uint)!bVar13 * auVar78._4_4_,
                                                                      (uint)(bVar63 & 1) *
                                                                      (int)auVar74._0_4_ |
                                                                      (uint)!(bool)(bVar63 & 1) *
                                                                      auVar78._0_4_)))),auVar114);
            auVar99 = vsubps_avx(auVar82,auVar115);
            auVar96 = vsubps_avx(auVar83,auVar116);
            auVar95 = vsubps_avx(auVar114,auVar117);
            auVar48._4_4_ = auVar97._4_4_ * fVar122;
            auVar48._0_4_ = auVar97._0_4_ * fVar120;
            auVar48._8_4_ = auVar97._8_4_ * fVar125;
            auVar48._12_4_ = auVar97._12_4_ * fVar126;
            auVar48._16_4_ = auVar97._16_4_ * 0.0;
            auVar48._20_4_ = auVar97._20_4_ * 0.0;
            auVar48._24_4_ = auVar97._24_4_ * 0.0;
            auVar48._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar48,auVar114,auVar81);
            auVar152._0_4_ = fVar121 * auVar81._0_4_;
            auVar152._4_4_ = fVar124 * auVar81._4_4_;
            auVar152._8_4_ = fVar123 * auVar81._8_4_;
            auVar152._12_4_ = fVar127 * auVar81._12_4_;
            auVar152._16_4_ = auVar81._16_4_ * 0.0;
            auVar152._20_4_ = auVar81._20_4_ * 0.0;
            auVar152._24_4_ = auVar81._24_4_ * 0.0;
            auVar152._28_4_ = 0;
            auVar130 = vfmsub231ps_fma(auVar152,auVar82,auVar109);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar130),auVar88,ZEXT1632(auVar77));
            auVar159._0_4_ = auVar109._0_4_ * auVar114._0_4_;
            auVar159._4_4_ = auVar109._4_4_ * auVar114._4_4_;
            auVar159._8_4_ = auVar109._8_4_ * auVar114._8_4_;
            auVar159._12_4_ = auVar109._12_4_ * auVar114._12_4_;
            auVar159._16_4_ = auVar109._16_4_ * fVar154;
            auVar159._20_4_ = auVar109._20_4_ * fVar161;
            auVar159._24_4_ = auVar109._24_4_ * fVar143;
            auVar159._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar159,auVar83,auVar97);
            auVar94 = vfmadd231ps_avx512vl(auVar108,auVar88,ZEXT1632(auVar77));
            auVar108 = vmulps_avx512vl(auVar95,auVar115);
            auVar108 = vfmsub231ps_avx512vl(auVar108,auVar99,auVar117);
            auVar49._4_4_ = auVar96._4_4_ * auVar117._4_4_;
            auVar49._0_4_ = auVar96._0_4_ * auVar117._0_4_;
            auVar49._8_4_ = auVar96._8_4_ * auVar117._8_4_;
            auVar49._12_4_ = auVar96._12_4_ * auVar117._12_4_;
            auVar49._16_4_ = auVar96._16_4_ * fVar71;
            auVar49._20_4_ = auVar96._20_4_ * fVar72;
            auVar49._24_4_ = auVar96._24_4_ * fVar119;
            auVar49._28_4_ = iVar2;
            auVar77 = vfmsub231ps_fma(auVar49,auVar116,auVar95);
            auVar160._0_4_ = auVar116._0_4_ * auVar99._0_4_;
            auVar160._4_4_ = auVar116._4_4_ * auVar99._4_4_;
            auVar160._8_4_ = auVar116._8_4_ * auVar99._8_4_;
            auVar160._12_4_ = auVar116._12_4_ * auVar99._12_4_;
            auVar160._16_4_ = fVar162 * auVar99._16_4_;
            auVar160._20_4_ = fVar163 * auVar99._20_4_;
            auVar160._24_4_ = fVar153 * auVar99._24_4_;
            auVar160._28_4_ = 0;
            auVar130 = vfmsub231ps_fma(auVar160,auVar96,auVar115);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar130),auVar88,auVar108);
            auVar84 = vfmadd231ps_avx512vl(auVar108,auVar88,ZEXT1632(auVar77));
            auVar108 = vmaxps_avx(auVar94,auVar84);
            uVar134 = vcmpps_avx512vl(auVar108,auVar88,2);
            local_2f0 = local_2f0 & (byte)uVar134;
            if (local_2f0 == 0) {
LAB_01b619d5:
              local_2f0 = 0;
            }
            else {
              auVar50._4_4_ = auVar95._4_4_ * auVar109._4_4_;
              auVar50._0_4_ = auVar95._0_4_ * auVar109._0_4_;
              auVar50._8_4_ = auVar95._8_4_ * auVar109._8_4_;
              auVar50._12_4_ = auVar95._12_4_ * auVar109._12_4_;
              auVar50._16_4_ = auVar95._16_4_ * auVar109._16_4_;
              auVar50._20_4_ = auVar95._20_4_ * auVar109._20_4_;
              auVar50._24_4_ = auVar95._24_4_ * auVar109._24_4_;
              auVar50._28_4_ = auVar108._28_4_;
              auVar19 = vfmsub231ps_fma(auVar50,auVar96,auVar97);
              auVar51._4_4_ = auVar97._4_4_ * auVar99._4_4_;
              auVar51._0_4_ = auVar97._0_4_ * auVar99._0_4_;
              auVar51._8_4_ = auVar97._8_4_ * auVar99._8_4_;
              auVar51._12_4_ = auVar97._12_4_ * auVar99._12_4_;
              auVar51._16_4_ = auVar97._16_4_ * auVar99._16_4_;
              auVar51._20_4_ = auVar97._20_4_ * auVar99._20_4_;
              auVar51._24_4_ = auVar97._24_4_ * auVar99._24_4_;
              auVar51._28_4_ = auVar97._28_4_;
              auVar130 = vfmsub231ps_fma(auVar51,auVar81,auVar95);
              auVar52._4_4_ = auVar96._4_4_ * auVar81._4_4_;
              auVar52._0_4_ = auVar96._0_4_ * auVar81._0_4_;
              auVar52._8_4_ = auVar96._8_4_ * auVar81._8_4_;
              auVar52._12_4_ = auVar96._12_4_ * auVar81._12_4_;
              auVar52._16_4_ = auVar96._16_4_ * auVar81._16_4_;
              auVar52._20_4_ = auVar96._20_4_ * auVar81._20_4_;
              auVar52._24_4_ = auVar96._24_4_ * auVar81._24_4_;
              auVar52._28_4_ = auVar96._28_4_;
              auVar192 = vfmsub231ps_fma(auVar52,auVar99,auVar109);
              auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar130),ZEXT1632(auVar192));
              auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar19),auVar88);
              auVar109 = vrcp14ps_avx512vl(auVar108);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar97 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar29);
              auVar77 = vfmadd132ps_fma(auVar97,auVar109,auVar109);
              auVar53._4_4_ = auVar192._4_4_ * auVar114._4_4_;
              auVar53._0_4_ = auVar192._0_4_ * auVar114._0_4_;
              auVar53._8_4_ = auVar192._8_4_ * auVar114._8_4_;
              auVar53._12_4_ = auVar192._12_4_ * auVar114._12_4_;
              auVar53._16_4_ = fVar154 * 0.0;
              auVar53._20_4_ = fVar161 * 0.0;
              auVar53._24_4_ = fVar143 * 0.0;
              auVar53._28_4_ = iVar1;
              auVar130 = vfmadd231ps_fma(auVar53,auVar83,ZEXT1632(auVar130));
              auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar82,ZEXT1632(auVar19));
              fVar154 = auVar77._0_4_;
              fVar161 = auVar77._4_4_;
              fVar162 = auVar77._8_4_;
              fVar163 = auVar77._12_4_;
              auVar109 = ZEXT1632(CONCAT412(auVar130._12_4_ * fVar163,
                                            CONCAT48(auVar130._8_4_ * fVar162,
                                                     CONCAT44(auVar130._4_4_ * fVar161,
                                                              auVar130._0_4_ * fVar154))));
              auVar59._4_4_ = uStack_27c;
              auVar59._0_4_ = local_280;
              auVar59._8_4_ = uStack_278;
              auVar59._12_4_ = uStack_274;
              auVar59._16_4_ = uStack_270;
              auVar59._20_4_ = uStack_26c;
              auVar59._24_4_ = uStack_268;
              auVar59._28_4_ = uStack_264;
              uVar134 = vcmpps_avx512vl(auVar109,auVar59,0xd);
              fVar143 = local_620->tfar;
              auVar30._4_4_ = fVar143;
              auVar30._0_4_ = fVar143;
              auVar30._8_4_ = fVar143;
              auVar30._12_4_ = fVar143;
              auVar30._16_4_ = fVar143;
              auVar30._20_4_ = fVar143;
              auVar30._24_4_ = fVar143;
              auVar30._28_4_ = fVar143;
              uVar23 = vcmpps_avx512vl(auVar109,auVar30,2);
              local_2f0 = (byte)uVar134 & (byte)uVar23 & local_2f0;
              if (local_2f0 == 0) goto LAB_01b619d5;
              uVar134 = vcmpps_avx512vl(auVar108,auVar88,4);
              if ((local_2f0 & (byte)uVar134) == 0) {
                local_2f0 = 0;
              }
              else {
                local_2f0 = local_2f0 & (byte)uVar134;
                fVar143 = auVar94._0_4_ * fVar154;
                fVar153 = auVar94._4_4_ * fVar161;
                auVar54._4_4_ = fVar153;
                auVar54._0_4_ = fVar143;
                fVar71 = auVar94._8_4_ * fVar162;
                auVar54._8_4_ = fVar71;
                fVar72 = auVar94._12_4_ * fVar163;
                auVar54._12_4_ = fVar72;
                fVar119 = auVar94._16_4_ * 0.0;
                auVar54._16_4_ = fVar119;
                fVar120 = auVar94._20_4_ * 0.0;
                auVar54._20_4_ = fVar120;
                fVar121 = auVar94._24_4_ * 0.0;
                auVar54._24_4_ = fVar121;
                auVar54._28_4_ = auVar94._28_4_;
                fVar154 = auVar84._0_4_ * fVar154;
                fVar161 = auVar84._4_4_ * fVar161;
                auVar55._4_4_ = fVar161;
                auVar55._0_4_ = fVar154;
                fVar162 = auVar84._8_4_ * fVar162;
                auVar55._8_4_ = fVar162;
                fVar163 = auVar84._12_4_ * fVar163;
                auVar55._12_4_ = fVar163;
                fVar122 = auVar84._16_4_ * 0.0;
                auVar55._16_4_ = fVar122;
                fVar124 = auVar84._20_4_ * 0.0;
                auVar55._20_4_ = fVar124;
                fVar125 = auVar84._24_4_ * 0.0;
                auVar55._24_4_ = fVar125;
                auVar55._28_4_ = auVar84._28_4_;
                auVar168._8_4_ = 0x3f800000;
                auVar168._0_8_ = &DAT_3f8000003f800000;
                auVar168._12_4_ = 0x3f800000;
                auVar168._16_4_ = 0x3f800000;
                auVar168._20_4_ = 0x3f800000;
                auVar168._24_4_ = 0x3f800000;
                auVar168._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx512vl(auVar168,auVar54);
                bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar62 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar62 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar62 >> 6) & 1);
                bVar18 = SUB81(uVar62 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar18 * auVar94._28_4_ |
                                              (uint)!bVar18 * auVar108._28_4_,
                                              CONCAT424((uint)bVar17 * (int)fVar121 |
                                                        (uint)!bVar17 * auVar108._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar120 |
                                                                  (uint)!bVar16 * auVar108._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar119 |
                                                                            (uint)!bVar15 *
                                                                            auVar108._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar72 |
                                                                                      (uint)!bVar14
                                                                                      * auVar108.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar71 |
                                                                  (uint)!bVar13 * auVar108._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar153 |
                                                                           (uint)!bVar12 *
                                                                           auVar108._4_4_,
                                                                           (uint)(bVar63 & 1) *
                                                                           (int)fVar143 |
                                                                           (uint)!(bool)(bVar63 & 1)
                                                                           * auVar108._0_4_))))))));
                auVar108 = vsubps_avx(auVar168,auVar55);
                bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar62 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar62 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar62 >> 6) & 1);
                bVar18 = SUB81(uVar62 >> 7,0);
                local_260._4_4_ = (uint)bVar12 * (int)fVar161 | (uint)!bVar12 * auVar108._4_4_;
                local_260._0_4_ =
                     (uint)(bVar63 & 1) * (int)fVar154 | (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
                local_260._8_4_ = (uint)bVar13 * (int)fVar162 | (uint)!bVar13 * auVar108._8_4_;
                local_260._12_4_ = (uint)bVar14 * (int)fVar163 | (uint)!bVar14 * auVar108._12_4_;
                local_260._16_4_ = (uint)bVar15 * (int)fVar122 | (uint)!bVar15 * auVar108._16_4_;
                local_260._20_4_ = (uint)bVar16 * (int)fVar124 | (uint)!bVar16 * auVar108._20_4_;
                local_260._24_4_ = (uint)bVar17 * (int)fVar125 | (uint)!bVar17 * auVar108._24_4_;
                local_260._28_4_ = (uint)bVar18 * auVar84._28_4_ | (uint)!bVar18 * auVar108._28_4_;
                in_ZMM21 = ZEXT3264(auVar109);
              }
            }
            auVar190 = ZEXT3264(local_4c0);
            auVar189 = ZEXT3264(local_4e0);
            auVar171 = ZEXT3264(local_5c0);
            auVar142 = ZEXT3264(local_5e0);
            if (local_2f0 != 0) {
              auVar108 = vsubps_avx(ZEXT1632(auVar76),auVar85);
              local_440 = in_ZMM20._0_32_;
              auVar108 = vfmadd213ps_avx512vl(auVar108,local_440,auVar85);
              auVar132._0_4_ = auVar108._0_4_ + auVar108._0_4_;
              auVar132._4_4_ = auVar108._4_4_ + auVar108._4_4_;
              auVar132._8_4_ = auVar108._8_4_ + auVar108._8_4_;
              auVar132._12_4_ = auVar108._12_4_ + auVar108._12_4_;
              auVar132._16_4_ = auVar108._16_4_ + auVar108._16_4_;
              auVar132._20_4_ = auVar108._20_4_ + auVar108._20_4_;
              auVar132._24_4_ = auVar108._24_4_ + auVar108._24_4_;
              auVar132._28_4_ = auVar108._28_4_ + auVar108._28_4_;
              fVar143 = local_5f8->depth_scale;
              auVar31._4_4_ = fVar143;
              auVar31._0_4_ = fVar143;
              auVar31._8_4_ = fVar143;
              auVar31._12_4_ = fVar143;
              auVar31._16_4_ = fVar143;
              auVar31._20_4_ = fVar143;
              auVar31._24_4_ = fVar143;
              auVar31._28_4_ = fVar143;
              auVar108 = vmulps_avx512vl(auVar132,auVar31);
              local_460 = in_ZMM21._0_32_;
              uVar134 = vcmpps_avx512vl(local_460,auVar108,6);
              local_2f0 = local_2f0 & (byte)uVar134;
              if (local_2f0 != 0) {
                auVar133._8_4_ = 0xbf800000;
                auVar133._0_8_ = 0xbf800000bf800000;
                auVar133._12_4_ = 0xbf800000;
                auVar133._16_4_ = 0xbf800000;
                auVar133._20_4_ = 0xbf800000;
                auVar133._24_4_ = 0xbf800000;
                auVar133._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_380 = vfmadd132ps_avx512vl(local_260,auVar133,auVar32);
                local_260 = local_380;
                auVar108 = local_260;
                local_340 = (undefined4)lVar68;
                local_330 = local_610;
                local_320 = local_4f0;
                uStack_318 = uStack_4e8;
                local_310 = local_500;
                uStack_308 = uStack_4f8;
                local_300 = local_490;
                uStack_2f8 = uStack_488;
                pGVar66 = (local_618->scene->geometries).items[local_5e8].ptr;
                if ((pGVar66->mask & local_620->mask) == 0) {
                  bVar63 = 0;
                }
                else if ((local_618->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar63 = 1, pGVar66->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar109 = vaddps_avx512vl(local_440,_DAT_02020f40);
                  auVar77 = vcvtsi2ss_avx512f(local_e0._0_16_,local_340);
                  fVar143 = auVar77._0_4_;
                  local_2e0[0] = (fVar143 + auVar109._0_4_) * local_3c0;
                  local_2e0[1] = (fVar143 + auVar109._4_4_) * (float)auStack_3bc._0_4_;
                  local_2e0[2] = (fVar143 + auVar109._8_4_) * (float)auStack_3bc._4_4_;
                  local_2e0[3] = (fVar143 + auVar109._12_4_) * fStack_3b4;
                  fStack_2d0 = (fVar143 + auVar109._16_4_) * fStack_3b0;
                  fStack_2cc = (fVar143 + auVar109._20_4_) * fStack_3ac;
                  fStack_2c8 = (fVar143 + auVar109._24_4_) * fStack_3a8;
                  fStack_2c4 = fVar143 + auVar109._28_4_;
                  local_260._0_8_ = local_380._0_8_;
                  local_260._8_8_ = local_380._8_8_;
                  local_260._16_8_ = local_380._16_8_;
                  local_260._24_8_ = local_380._24_8_;
                  local_2c0 = local_260._0_8_;
                  uStack_2b8 = local_260._8_8_;
                  uStack_2b0 = local_260._16_8_;
                  uStack_2a8 = local_260._24_8_;
                  local_2a0 = local_460;
                  local_200 = local_4f0;
                  uStack_1f8 = uStack_4e8;
                  lVar64 = 0;
                  uVar65 = (ulong)local_2f0;
                  for (uVar62 = uVar65; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000
                      ) {
                    lVar64 = lVar64 + 1;
                  }
                  local_210 = local_500;
                  uStack_208 = uStack_4f8;
                  local_220 = local_490;
                  uStack_218 = uStack_488;
                  local_530 = CONCAT44(local_530._4_4_,1);
                  local_520 = pGVar66;
                  local_3a0 = local_440;
                  local_360 = local_460;
                  local_33c = iVar10;
                  local_260 = auVar108;
                  do {
                    local_564 = local_2e0[lVar64];
                    local_560 = *(undefined4 *)((long)&local_2c0 + lVar64 * 4);
                    local_4a0 = local_620->tfar;
                    local_510._0_8_ = lVar64;
                    local_620->tfar = *(float *)(local_2a0 + lVar64 * 4);
                    local_5a0.context = local_618->user;
                    fVar143 = 1.0 - local_564;
                    auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(local_564 * (fVar143 + fVar143))),
                                               ZEXT416((uint)fVar143),ZEXT416((uint)fVar143));
                    auVar130 = ZEXT416((uint)local_564);
                    auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                              ZEXT416(0xc0a00000));
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(local_564 * local_564 * 3.0)),
                                              ZEXT416((uint)(local_564 + local_564)),auVar77);
                    auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                              ZEXT416(0x40000000));
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * fVar143 * -3.0)),
                                              ZEXT416((uint)(fVar143 + fVar143)),auVar77);
                    auVar130 = vfmadd231ss_fma(ZEXT416((uint)(local_564 * local_564)),auVar130,
                                               ZEXT416((uint)(fVar143 * -2.0)));
                    fVar143 = auVar19._0_4_ * 0.5;
                    fVar154 = auVar76._0_4_ * 0.5;
                    fVar161 = auVar77._0_4_ * 0.5;
                    fVar162 = auVar130._0_4_ * 0.5;
                    auVar150._0_4_ = fVar162 * (float)local_220;
                    auVar150._4_4_ = fVar162 * local_220._4_4_;
                    auVar150._8_4_ = fVar162 * (float)uStack_218;
                    auVar150._12_4_ = fVar162 * uStack_218._4_4_;
                    auVar166._4_4_ = fVar161;
                    auVar166._0_4_ = fVar161;
                    auVar166._8_4_ = fVar161;
                    auVar166._12_4_ = fVar161;
                    auVar60._8_8_ = uStack_208;
                    auVar60._0_8_ = local_210;
                    auVar77 = vfmadd132ps_fma(auVar166,auVar150,auVar60);
                    auVar151._4_4_ = fVar154;
                    auVar151._0_4_ = fVar154;
                    auVar151._8_4_ = fVar154;
                    auVar151._12_4_ = fVar154;
                    auVar61._8_8_ = uStack_1f8;
                    auVar61._0_8_ = local_200;
                    auVar77 = vfmadd132ps_fma(auVar151,auVar77,auVar61);
                    auVar141._4_4_ = fVar143;
                    auVar141._0_4_ = fVar143;
                    auVar141._8_4_ = fVar143;
                    auVar141._12_4_ = fVar143;
                    auVar77 = vfmadd213ps_fma(auVar141,local_610,auVar77);
                    local_570 = vmovlps_avx(auVar77);
                    local_568 = vextractps_avx(auVar77,2);
                    local_55c = (undefined4)local_538;
                    local_558 = (undefined4)local_5e8;
                    local_554 = (local_5a0.context)->instID[0];
                    local_550 = (local_5a0.context)->instPrimID[0];
                    local_624 = -1;
                    local_5a0.valid = &local_624;
                    local_5a0.geometryUserPtr = pGVar66->userPtr;
                    local_5a0.hit = (RTCHitN *)&local_570;
                    local_5a0.N = 1;
                    local_5f0 = uVar65;
                    local_5a0.ray = (RTCRayN *)local_620;
                    if ((pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar66->occlusionFilterN)(&local_5a0), pGVar66 = local_520,
                       *local_5a0.valid != 0)) {
                      auVar77 = auVar193._0_16_;
                      p_Var11 = local_618->args->filter;
                      if (p_Var11 == (RTCFilterFunctionN)0x0) break;
                      if (((local_618->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar66->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var11)(&local_5a0);
                        pGVar66 = local_520;
                      }
                      auVar77 = auVar193._0_16_;
                      if (*local_5a0.valid != 0) break;
                    }
                    auVar77 = auVar193._0_16_;
                    local_620->tfar = local_4a0;
                    lVar64 = 0;
                    uVar65 = local_5f0 ^ 1L << (local_510._0_8_ & 0x3f);
                    for (uVar62 = uVar65; (uVar62 & 1) == 0;
                        uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                      lVar64 = lVar64 + 1;
                    }
                    local_530 = CONCAT44(local_530._4_4_,(int)CONCAT71(local_510._1_7_,uVar65 != 0))
                    ;
                  } while (uVar65 != 0);
                  bVar63 = (byte)local_530 & 1;
                  auVar77 = vxorps_avx512vl(auVar77,auVar77);
                  auVar193 = ZEXT1664(auVar77);
                  auVar171 = ZEXT3264(local_5c0);
                  in_ZMM20 = ZEXT3264(local_440);
                  auVar142 = ZEXT3264(local_5e0);
                  in_ZMM21 = ZEXT3264(local_460);
                  auVar191 = ZEXT3264(local_400);
                  auVar190 = ZEXT3264(local_4c0);
                  auVar189 = ZEXT3264(local_4e0);
                }
                bVar69 = (bool)(bVar69 | bVar63);
              }
            }
          }
          lVar68 = lVar68 + 8;
        } while ((int)lVar68 < iVar10);
      }
      if (bVar69 != false) {
        return local_629;
      }
      fVar143 = local_620->tfar;
      auVar25._4_4_ = fVar143;
      auVar25._0_4_ = fVar143;
      auVar25._8_4_ = fVar143;
      auVar25._12_4_ = fVar143;
      uVar134 = vcmpps_avx512vl(local_1f0,auVar25,2);
      uVar67 = (uint)uVar70 & (uint)uVar134;
      uVar70 = (ulong)uVar67;
      local_629 = uVar67 != 0;
      context = local_618;
      ray = local_620;
      pre = local_5f8;
    } while (local_629);
  }
  return local_629;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }